

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [60];
  undefined1 auVar53 [60];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  byte bVar80;
  uint uVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  long lVar85;
  ulong uVar86;
  long lVar87;
  bool bVar88;
  ulong uVar89;
  uint uVar90;
  uint uVar155;
  uint uVar156;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  uint uVar157;
  uint uVar161;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  uint uVar158;
  uint uVar159;
  uint uVar160;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar154 [64];
  float fVar162;
  float fVar163;
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  vint4 bi;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar222 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined4 uVar239;
  vint4 ai_2;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  vint4 ai_1;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar264;
  float fVar265;
  vint4 ai;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [32];
  float fVar270;
  float fVar277;
  float fVar278;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [64];
  float t;
  float fVar286;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar293;
  undefined1 auVar292 [64];
  float s;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [64];
  float s_1;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [64];
  undefined1 auVar303 [64];
  undefined1 auVar304 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_bd0;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 (*local_ab8) [32];
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  ulong local_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined4 uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  undefined8 uStack_160;
  float afStack_158 [74];
  undefined1 auVar140 [32];
  undefined1 auVar153 [64];
  
  PVar2 = prim[1];
  uVar89 = (ulong)(byte)PVar2;
  lVar87 = uVar89 * 0x25;
  fVar162 = *(float *)(prim + lVar87 + 0x12);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar95 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + lVar87 + 6));
  auVar225._0_4_ = fVar162 * auVar95._0_4_;
  auVar225._4_4_ = fVar162 * auVar95._4_4_;
  auVar225._8_4_ = fVar162 * auVar95._8_4_;
  auVar225._12_4_ = fVar162 * auVar95._12_4_;
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar164._0_4_ = fVar162 * auVar94._0_4_;
  auVar164._4_4_ = fVar162 * auVar94._4_4_;
  auVar164._8_4_ = fVar162 * auVar94._8_4_;
  auVar164._12_4_ = fVar162 * auVar94._12_4_;
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xf + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar288 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + 6)));
  auVar288 = vcvtdq2ps_avx(auVar288);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar89 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1a + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1b + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar287 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0x1c + 6)));
  auVar287 = vcvtdq2ps_avx(auVar287);
  auVar252._4_4_ = auVar164._0_4_;
  auVar252._0_4_ = auVar164._0_4_;
  auVar252._8_4_ = auVar164._0_4_;
  auVar252._12_4_ = auVar164._0_4_;
  auVar100 = vshufps_avx(auVar164,auVar164,0x55);
  auVar23 = vshufps_avx(auVar164,auVar164,0xaa);
  fVar162 = auVar23._0_4_;
  auVar209._0_4_ = fVar162 * auVar97._0_4_;
  fVar259 = auVar23._4_4_;
  auVar209._4_4_ = fVar259 * auVar97._4_4_;
  fVar264 = auVar23._8_4_;
  auVar209._8_4_ = fVar264 * auVar97._8_4_;
  fVar265 = auVar23._12_4_;
  auVar209._12_4_ = fVar265 * auVar97._12_4_;
  auVar187._0_4_ = auVar105._0_4_ * fVar162;
  auVar187._4_4_ = auVar105._4_4_ * fVar259;
  auVar187._8_4_ = auVar105._8_4_ * fVar264;
  auVar187._12_4_ = auVar105._12_4_ * fVar265;
  auVar165._0_4_ = auVar287._0_4_ * fVar162;
  auVar165._4_4_ = auVar287._4_4_ * fVar259;
  auVar165._8_4_ = auVar287._8_4_ * fVar264;
  auVar165._12_4_ = auVar287._12_4_ * fVar265;
  auVar23 = vfmadd231ps_fma(auVar209,auVar100,auVar94);
  auVar102 = vfmadd231ps_fma(auVar187,auVar100,auVar288);
  auVar100 = vfmadd231ps_fma(auVar165,auVar99,auVar100);
  auVar101 = vfmadd231ps_fma(auVar23,auVar252,auVar95);
  auVar102 = vfmadd231ps_fma(auVar102,auVar252,auVar98);
  auVar103 = vfmadd231ps_fma(auVar100,auVar96,auVar252);
  auVar301._4_4_ = auVar225._0_4_;
  auVar301._0_4_ = auVar225._0_4_;
  auVar301._8_4_ = auVar225._0_4_;
  auVar301._12_4_ = auVar225._0_4_;
  auVar100 = vshufps_avx(auVar225,auVar225,0x55);
  auVar23 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar162 = auVar23._0_4_;
  auVar253._0_4_ = fVar162 * auVar97._0_4_;
  fVar259 = auVar23._4_4_;
  auVar253._4_4_ = fVar259 * auVar97._4_4_;
  fVar264 = auVar23._8_4_;
  auVar253._8_4_ = fVar264 * auVar97._8_4_;
  fVar265 = auVar23._12_4_;
  auVar253._12_4_ = fVar265 * auVar97._12_4_;
  auVar240._0_4_ = auVar105._0_4_ * fVar162;
  auVar240._4_4_ = auVar105._4_4_ * fVar259;
  auVar240._8_4_ = auVar105._8_4_ * fVar264;
  auVar240._12_4_ = auVar105._12_4_ * fVar265;
  auVar226._0_4_ = auVar287._0_4_ * fVar162;
  auVar226._4_4_ = auVar287._4_4_ * fVar259;
  auVar226._8_4_ = auVar287._8_4_ * fVar264;
  auVar226._12_4_ = auVar287._12_4_ * fVar265;
  auVar94 = vfmadd231ps_fma(auVar253,auVar100,auVar94);
  auVar97 = vfmadd231ps_fma(auVar240,auVar100,auVar288);
  auVar288 = vfmadd231ps_fma(auVar226,auVar100,auVar99);
  auVar28 = vfmadd231ps_fma(auVar94,auVar301,auVar95);
  auVar164 = vfmadd231ps_fma(auVar97,auVar301,auVar98);
  auVar283._8_4_ = 0x7fffffff;
  auVar283._0_8_ = 0x7fffffff7fffffff;
  auVar283._12_4_ = 0x7fffffff;
  auVar165 = vfmadd231ps_fma(auVar288,auVar301,auVar96);
  auVar95 = vandps_avx(auVar283,auVar101);
  auVar271._8_4_ = 0x219392ef;
  auVar271._0_8_ = 0x219392ef219392ef;
  auVar271._12_4_ = 0x219392ef;
  uVar79 = vcmpps_avx512vl(auVar95,auVar271,1);
  bVar9 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar101._0_4_;
  bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar101._4_4_;
  bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar101._8_4_;
  bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar101._12_4_;
  auVar95 = vandps_avx(auVar283,auVar102);
  uVar79 = vcmpps_avx512vl(auVar95,auVar271,1);
  bVar9 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._0_4_;
  bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._4_4_;
  bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._8_4_;
  bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar102._12_4_;
  auVar95 = vandps_avx(auVar283,auVar103);
  uVar79 = vcmpps_avx512vl(auVar95,auVar271,1);
  bVar9 = (bool)((byte)uVar79 & 1);
  auVar93._0_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._0_4_;
  bVar9 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._4_4_;
  bVar9 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._8_4_;
  bVar9 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar9 * 0x219392ef | (uint)!bVar9 * auVar103._12_4_;
  auVar94 = vrcp14ps_avx512vl(auVar91);
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = &DAT_3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar91,auVar94,auVar272);
  auVar101 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar95 = vfnmadd213ps_fma(auVar92,auVar94,auVar272);
  auVar103 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar93);
  auVar95 = vfnmadd213ps_fma(auVar93,auVar94,auVar272);
  auVar104 = vfmadd132ps_fma(auVar95,auVar94,auVar94);
  fVar162 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar87 + 0x16)) *
            *(float *)(prim + lVar87 + 0x1a);
  auVar260._4_4_ = fVar162;
  auVar260._0_4_ = fVar162;
  auVar260._8_4_ = fVar162;
  auVar260._12_4_ = fVar162;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar94 = vpmovsxwd_avx(auVar94);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar98 = vsubps_avx(auVar94,auVar95);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar94 = vpmovsxwd_avx(auVar97);
  auVar97 = vfmadd213ps_fma(auVar98,auVar260,auVar95);
  auVar95 = vcvtdq2ps_avx(auVar94);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar89 * 0xd + 6);
  auVar94 = vpmovsxwd_avx(auVar98);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar95);
  auVar98 = vfmadd213ps_fma(auVar94,auVar260,auVar95);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar89 * 0x12 + 6);
  auVar95 = vpmovsxwd_avx(auVar288);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar79 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar89 * 2 + uVar79 + 6);
  auVar94 = vpmovsxwd_avx(auVar105);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar95);
  auVar288 = vfmadd213ps_fma(auVar94,auVar260,auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar95 = vpmovsxwd_avx(auVar96);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar89 * 0x18 + 6);
  auVar94 = vpmovsxwd_avx(auVar99);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar95);
  auVar105 = vfmadd213ps_fma(auVar94,auVar260,auVar95);
  auVar297 = ZEXT1664(auVar105);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = *(ulong *)(prim + uVar89 * 0x1d + 6);
  auVar95 = vpmovsxwd_avx(auVar287);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar89 + (ulong)(byte)PVar2 * 0x20 + 6);
  auVar94 = vpmovsxwd_avx(auVar100);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar95);
  auVar96 = vfmadd213ps_fma(auVar94,auVar260,auVar95);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar2 * 0x20 - uVar89) + 6);
  auVar95 = vpmovsxwd_avx(auVar23);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar89 * 0x23 + 6);
  auVar94 = vpmovsxwd_avx(auVar102);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar95);
  auVar94 = vfmadd213ps_fma(auVar94,auVar260,auVar95);
  auVar95 = vsubps_avx(auVar97,auVar28);
  auVar261._0_4_ = auVar101._0_4_ * auVar95._0_4_;
  auVar261._4_4_ = auVar101._4_4_ * auVar95._4_4_;
  auVar261._8_4_ = auVar101._8_4_ * auVar95._8_4_;
  auVar261._12_4_ = auVar101._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar98,auVar28);
  auVar210._0_4_ = auVar101._0_4_ * auVar95._0_4_;
  auVar210._4_4_ = auVar101._4_4_ * auVar95._4_4_;
  auVar210._8_4_ = auVar101._8_4_ * auVar95._8_4_;
  auVar210._12_4_ = auVar101._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar288,auVar164);
  auVar254._0_4_ = auVar103._0_4_ * auVar95._0_4_;
  auVar254._4_4_ = auVar103._4_4_ * auVar95._4_4_;
  auVar254._8_4_ = auVar103._8_4_ * auVar95._8_4_;
  auVar254._12_4_ = auVar103._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar105,auVar164);
  auVar188._0_4_ = auVar103._0_4_ * auVar95._0_4_;
  auVar188._4_4_ = auVar103._4_4_ * auVar95._4_4_;
  auVar188._8_4_ = auVar103._8_4_ * auVar95._8_4_;
  auVar188._12_4_ = auVar103._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar96,auVar165);
  auVar241._0_4_ = auVar104._0_4_ * auVar95._0_4_;
  auVar241._4_4_ = auVar104._4_4_ * auVar95._4_4_;
  auVar241._8_4_ = auVar104._8_4_ * auVar95._8_4_;
  auVar241._12_4_ = auVar104._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar94,auVar165);
  auVar166._0_4_ = auVar104._0_4_ * auVar95._0_4_;
  auVar166._4_4_ = auVar104._4_4_ * auVar95._4_4_;
  auVar166._8_4_ = auVar104._8_4_ * auVar95._8_4_;
  auVar166._12_4_ = auVar104._12_4_ * auVar95._12_4_;
  auVar95 = vpminsd_avx(auVar261,auVar210);
  auVar94 = vpminsd_avx(auVar254,auVar188);
  auVar95 = vmaxps_avx(auVar95,auVar94);
  auVar94 = vpminsd_avx(auVar241,auVar166);
  uVar239 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar101._4_4_ = uVar239;
  auVar101._0_4_ = uVar239;
  auVar101._8_4_ = uVar239;
  auVar101._12_4_ = uVar239;
  auVar94 = vmaxps_avx512vl(auVar94,auVar101);
  auVar95 = vmaxps_avx(auVar95,auVar94);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  local_7f0 = vmulps_avx512vl(auVar95,auVar103);
  auVar95 = vpmaxsd_avx(auVar261,auVar210);
  auVar94 = vpmaxsd_avx(auVar254,auVar188);
  auVar95 = vminps_avx(auVar95,auVar94);
  auVar94 = vpmaxsd_avx(auVar241,auVar166);
  uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar104._4_4_ = uVar239;
  auVar104._0_4_ = uVar239;
  auVar104._8_4_ = uVar239;
  auVar104._12_4_ = uVar239;
  auVar94 = vminps_avx512vl(auVar94,auVar104);
  auVar95 = vminps_avx(auVar95,auVar94);
  auVar28._8_4_ = 0x3f800003;
  auVar28._0_8_ = 0x3f8000033f800003;
  auVar28._12_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar28);
  auVar94 = vpbroadcastd_avx512vl();
  uVar24 = vcmpps_avx512vl(local_7f0,auVar95,2);
  local_968 = vpcmpgtd_avx512vl(auVar94,_DAT_01ff0cf0);
  local_968 = ((byte)uVar24 & 0xf) & local_968;
  if ((char)local_968 == '\0') {
    return;
  }
  local_ab8 = (undefined1 (*) [32])local_240;
  auVar186 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar186);
  auVar186 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar292 = ZEXT3264(_DAT_02020f20);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar304 = ZEXT3264(auVar106);
LAB_01cb1c3d:
  lVar87 = 0;
  for (uVar79 = local_968; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar87 = lVar87 + 1;
  }
  uVar81 = *(uint *)(prim + 2);
  local_aa8 = (ulong)*(uint *)(prim + lVar87 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar81].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           local_aa8 *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar162 = (pGVar3->time_range).lower;
  fVar162 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar162) / ((pGVar3->time_range).upper - fVar162));
  auVar95 = vroundss_avx(ZEXT416((uint)fVar162),ZEXT416((uint)fVar162),9);
  auVar95 = vminss_avx(auVar95,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar95 = vmaxss_avx(ZEXT816(0) << 0x20,auVar95);
  fVar162 = fVar162 - auVar95._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar85 = (long)(int)auVar95._0_4_ * 0x38;
  lVar87 = *(long *)(_Var4 + 0x10 + lVar85);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar85);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar85);
  pfVar1 = (float *)(lVar5 + uVar79 * lVar6);
  auVar189._0_4_ = fVar162 * *pfVar1;
  auVar189._4_4_ = fVar162 * pfVar1[1];
  auVar189._8_4_ = fVar162 * pfVar1[2];
  auVar189._12_4_ = fVar162 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar79 + 1) * lVar6);
  auVar211._0_4_ = fVar162 * *pfVar1;
  auVar211._4_4_ = fVar162 * pfVar1[1];
  auVar211._8_4_ = fVar162 * pfVar1[2];
  auVar211._12_4_ = fVar162 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar79 + 2) * lVar6);
  auVar227._0_4_ = fVar162 * *pfVar1;
  auVar227._4_4_ = fVar162 * pfVar1[1];
  auVar227._8_4_ = fVar162 * pfVar1[2];
  auVar227._12_4_ = fVar162 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar79 + 3));
  auVar242._0_4_ = fVar162 * *pfVar1;
  auVar242._4_4_ = fVar162 * pfVar1[1];
  auVar242._8_4_ = fVar162 * pfVar1[2];
  auVar242._12_4_ = fVar162 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar85);
  fVar162 = 1.0 - fVar162;
  auVar167._4_4_ = fVar162;
  auVar167._0_4_ = fVar162;
  auVar167._8_4_ = fVar162;
  auVar167._12_4_ = fVar162;
  auVar97 = vfmadd231ps_fma(auVar189,auVar167,*(undefined1 (*) [16])(lVar5 + lVar87 * uVar79));
  auVar98 = vfmadd231ps_fma(auVar211,auVar167,*(undefined1 (*) [16])(lVar5 + lVar87 * (uVar79 + 1)))
  ;
  auVar288 = vfmadd231ps_fma(auVar227,auVar167,*(undefined1 (*) [16])(lVar5 + lVar87 * (uVar79 + 2))
                            );
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar94 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar107 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar95 = vunpcklps_avx512vl(auVar106._0_16_,auVar107._0_16_);
  local_aa0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar303 = ZEXT3264(local_aa0);
  auVar99 = local_aa0._0_16_;
  local_a50 = vinsertps_avx512f(auVar95,auVar99,0x28);
  fVar162 = *(float *)(ray + k * 4 + 0xc0);
  auVar262._0_4_ = auVar97._0_4_ + auVar98._0_4_;
  auVar262._4_4_ = auVar97._4_4_ + auVar98._4_4_;
  auVar262._8_4_ = auVar97._8_4_ + auVar98._8_4_;
  auVar262._12_4_ = auVar97._12_4_ + auVar98._12_4_;
  auVar29._8_4_ = 0x3f000000;
  auVar29._0_8_ = 0x3f0000003f000000;
  auVar29._12_4_ = 0x3f000000;
  auVar95 = vmulps_avx512vl(auVar262,auVar29);
  auVar95 = vsubps_avx(auVar95,auVar94);
  auVar95 = vdpps_avx(auVar95,local_a50,0x7f);
  local_a60 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar273._4_12_ = ZEXT812(0) << 0x20;
  auVar273._0_4_ = local_a60._0_4_;
  auVar96 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar273);
  auVar105 = vfnmadd213ss_fma(auVar96,local_a60,ZEXT416(0x40000000));
  local_720 = auVar95._0_4_ * auVar105._0_4_ * auVar96._0_4_;
  auVar274._4_4_ = local_720;
  auVar274._0_4_ = local_720;
  auVar274._8_4_ = local_720;
  auVar274._12_4_ = local_720;
  fStack_930 = local_720;
  _local_940 = auVar274;
  fStack_92c = local_720;
  fStack_928 = local_720;
  fStack_924 = local_720;
  auVar95 = vfmadd231ps_fma(auVar94,local_a50,auVar274);
  auVar95 = vblendps_avx(auVar95,ZEXT816(0) << 0x40,8);
  auVar94 = vsubps_avx(auVar97,auVar95);
  auVar97 = vsubps_avx(auVar288,auVar95);
  auVar285 = ZEXT1664(auVar97);
  auVar108 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar302 = ZEXT3264(auVar108);
  auVar288 = vfmadd231ps_fma(auVar242,auVar167,*(undefined1 (*) [16])(lVar5 + lVar87 * (uVar79 + 3))
                            );
  auVar98 = vsubps_avx(auVar98,auVar95);
  auVar95 = vsubps_avx(auVar288,auVar95);
  local_520 = auVar94._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  local_9e0 = ZEXT1632(auVar94);
  local_540 = vpermps_avx2(auVar108,local_9e0);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  local_560 = vpermps_avx2(auVar109,local_9e0);
  auVar110._8_4_ = 3;
  auVar110._0_8_ = 0x300000003;
  auVar110._12_4_ = 3;
  auVar110._16_4_ = 3;
  auVar110._20_4_ = 3;
  auVar110._24_4_ = 3;
  auVar110._28_4_ = 3;
  local_580 = vpermps_avx2(auVar110,local_9e0);
  local_5a0 = auVar98._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  local_a20 = ZEXT1632(auVar98);
  local_5c0 = vpermps_avx2(auVar108,local_a20);
  local_5e0 = vpermps_avx2(auVar109,local_a20);
  local_600 = vpermps_avx2(auVar110,local_a20);
  local_620 = auVar97._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_a00 = ZEXT1632(auVar97);
  local_640 = vpermps_avx2(auVar108,local_a00);
  local_660 = vpermps_avx2(auVar109,local_a00);
  local_680 = vpermps_avx2(auVar110,local_a00);
  uVar239 = auVar95._0_4_;
  local_7a0._4_4_ = uVar239;
  local_7a0._0_4_ = uVar239;
  fStack_798 = (float)uVar239;
  fStack_794 = (float)uVar239;
  fStack_790 = (float)uVar239;
  fStack_78c = (float)uVar239;
  fStack_788 = (float)uVar239;
  register0x000012dc = uVar239;
  auVar238 = ZEXT3264(_local_7a0);
  _local_a40 = ZEXT1632(auVar95);
  _local_6a0 = vpermps_avx2(auVar108,_local_a40);
  _local_6c0 = vpermps_avx2(auVar109,_local_a40);
  local_6e0 = vpermps_avx2(auVar110,_local_a40);
  auVar95 = vmulss_avx512f(auVar99,auVar99);
  auVar108 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar107,auVar107);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
  local_700._0_4_ = auVar108._0_4_;
  local_700._4_4_ = local_700._0_4_;
  local_700._8_4_ = local_700._0_4_;
  local_700._12_4_ = local_700._0_4_;
  local_700._16_4_ = local_700._0_4_;
  local_700._20_4_ = local_700._0_4_;
  local_700._24_4_ = local_700._0_4_;
  local_700._28_4_ = local_700._0_4_;
  local_7c0 = vandps_avx(auVar186._0_32_,local_700);
  local_9b0 = ZEXT416((uint)local_720);
  local_720 = fVar162 - local_720;
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  auVar149 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar149);
  uVar79 = 0;
  local_ab0 = 1;
  auVar149 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar149);
  auVar95 = vsqrtss_avx(local_a60,local_a60);
  auVar94 = vsqrtss_avx(local_a60,local_a60);
  auVar224 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar108 = auVar149._32_32_;
  do {
    local_a70 = auVar224._0_16_;
    auVar97 = vmovshdup_avx(local_a70);
    fVar264 = auVar224._0_4_;
    fVar259 = auVar97._0_4_ - fVar264;
    fVar269 = fVar259 * 0.04761905;
    auVar247._4_4_ = fVar264;
    auVar247._0_4_ = fVar264;
    auVar247._8_4_ = fVar264;
    auVar247._12_4_ = fVar264;
    auVar247._16_4_ = fVar264;
    auVar247._20_4_ = fVar264;
    auVar247._24_4_ = fVar264;
    auVar247._28_4_ = fVar264;
    auVar176._4_4_ = fVar259;
    auVar176._0_4_ = fVar259;
    auVar176._8_4_ = fVar259;
    auVar176._12_4_ = fVar259;
    auVar176._16_4_ = fVar259;
    auVar176._20_4_ = fVar259;
    auVar176._24_4_ = fVar259;
    auVar176._28_4_ = fVar259;
    auVar97 = vfmadd231ps_fma(auVar247,auVar176,auVar292._0_32_);
    auVar109 = vsubps_avx512vl(auVar304._0_32_,ZEXT1632(auVar97));
    auVar110 = vxorps_avx512vl(ZEXT1632(auVar97),auVar302._0_32_);
    fVar270 = auVar109._0_4_;
    fVar277 = auVar109._4_4_;
    fVar278 = auVar109._8_4_;
    fVar279 = auVar109._12_4_;
    fVar280 = auVar109._16_4_;
    fVar281 = auVar109._20_4_;
    fVar282 = auVar109._24_4_;
    auVar113._4_4_ = fVar277 * fVar277 * auVar110._4_4_;
    auVar113._0_4_ = fVar270 * fVar270 * auVar110._0_4_;
    auVar113._8_4_ = fVar278 * fVar278 * auVar110._8_4_;
    auVar113._12_4_ = fVar279 * fVar279 * auVar110._12_4_;
    auVar113._16_4_ = fVar280 * fVar280 * auVar110._16_4_;
    auVar113._20_4_ = fVar281 * fVar281 * auVar110._20_4_;
    auVar113._24_4_ = fVar282 * fVar282 * auVar110._24_4_;
    auVar113._28_4_ = auVar110._28_4_;
    fVar264 = auVar97._0_4_;
    fVar265 = auVar97._4_4_;
    fVar266 = auVar97._8_4_;
    fVar267 = auVar97._12_4_;
    auVar292._28_36_ = auVar238._28_36_;
    auVar292._0_28_ =
         ZEXT1628(CONCAT412(fVar267 * fVar267,
                            CONCAT48(fVar266 * fVar266,CONCAT44(fVar265 * fVar265,fVar264 * fVar264)
                                    )));
    fVar286 = fVar264 * 3.0;
    fVar289 = fVar265 * 3.0;
    fVar290 = fVar266 * 3.0;
    fVar291 = fVar267 * 3.0;
    auVar304._28_36_ = auVar186._28_36_;
    auVar304._0_28_ = ZEXT1628(CONCAT412(fVar291,CONCAT48(fVar290,CONCAT44(fVar289,fVar286))));
    fVar293 = auVar186._28_4_ + -5.0;
    auVar204._0_4_ = (fVar286 + -5.0) * fVar264 * fVar264 + 2.0;
    auVar204._4_4_ = (fVar289 + -5.0) * fVar265 * fVar265 + 2.0;
    auVar204._8_4_ = (fVar290 + -5.0) * fVar266 * fVar266 + 2.0;
    auVar204._12_4_ = (fVar291 + -5.0) * fVar267 * fVar267 + 2.0;
    auVar204._16_4_ = 0x40000000;
    auVar204._20_4_ = 0x40000000;
    auVar204._24_4_ = 0x40000000;
    auVar204._28_4_ = 0x40000000;
    auVar186._0_4_ = fVar270 * fVar270;
    auVar186._4_4_ = fVar277 * fVar277;
    auVar186._8_4_ = fVar278 * fVar278;
    auVar186._12_4_ = fVar279 * fVar279;
    auVar186._16_4_ = fVar280 * fVar280;
    auVar186._20_4_ = fVar281 * fVar281;
    auVar186._28_36_ = auVar297._28_36_;
    auVar186._24_4_ = fVar282 * fVar282;
    auVar222._0_4_ = auVar186._0_4_ * (fVar270 * 3.0 + -5.0) + 2.0;
    auVar222._4_4_ = auVar186._4_4_ * (fVar277 * 3.0 + -5.0) + 2.0;
    auVar222._8_4_ = auVar186._8_4_ * (fVar278 * 3.0 + -5.0) + 2.0;
    auVar222._12_4_ = auVar186._12_4_ * (fVar279 * 3.0 + -5.0) + 2.0;
    auVar222._16_4_ = auVar186._16_4_ * (fVar280 * 3.0 + -5.0) + 2.0;
    auVar222._20_4_ = auVar186._20_4_ * (fVar281 * 3.0 + -5.0) + 2.0;
    auVar222._24_4_ = auVar186._24_4_ * (fVar282 * 3.0 + -5.0) + 2.0;
    auVar222._28_4_ = auVar285._28_4_ + -5.0 + 2.0;
    auVar111 = vxorps_avx512vl(auVar109,auVar302._0_32_);
    auVar115._4_4_ = fVar265 * fVar265 * auVar111._4_4_;
    auVar115._0_4_ = fVar264 * fVar264 * auVar111._0_4_;
    auVar115._8_4_ = fVar266 * fVar266 * auVar111._8_4_;
    auVar115._12_4_ = fVar267 * fVar267 * auVar111._12_4_;
    auVar115._16_4_ = auVar111._16_4_ * 0.0 * 0.0;
    auVar115._20_4_ = auVar111._20_4_ * 0.0 * 0.0;
    auVar115._24_4_ = auVar111._24_4_ * 0.0 * 0.0;
    auVar115._28_4_ = auVar111._28_4_;
    auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar111 = vmulps_avx512vl(auVar113,auVar112);
    auVar113 = vmulps_avx512vl(auVar204,auVar112);
    auVar114 = vmulps_avx512vl(auVar222,auVar112);
    auVar115 = vmulps_avx512vl(auVar115,auVar112);
    fVar259 = auVar115._0_4_;
    fVar268 = auVar115._4_4_;
    auVar118._4_4_ = fVar268 * (float)local_7a0._4_4_;
    auVar118._0_4_ = fVar259 * (float)local_7a0._0_4_;
    fVar163 = auVar115._8_4_;
    auVar118._8_4_ = fVar163 * fStack_798;
    fVar255 = auVar115._12_4_;
    auVar118._12_4_ = fVar255 * fStack_794;
    fVar256 = auVar115._16_4_;
    auVar118._16_4_ = fVar256 * fStack_790;
    fVar257 = auVar115._20_4_;
    auVar118._20_4_ = fVar257 * fStack_78c;
    fVar258 = auVar115._24_4_;
    auVar118._24_4_ = fVar258 * fStack_788;
    auVar118._28_4_ = 0x40000000;
    auVar119._4_4_ = (float)local_6a0._4_4_ * fVar268;
    auVar119._0_4_ = (float)local_6a0._0_4_ * fVar259;
    auVar119._8_4_ = fStack_698 * fVar163;
    auVar119._12_4_ = fStack_694 * fVar255;
    auVar119._16_4_ = fStack_690 * fVar256;
    auVar119._20_4_ = fStack_68c * fVar257;
    auVar119._24_4_ = fStack_688 * fVar258;
    auVar119._28_4_ = auVar110._28_4_;
    auVar120._4_4_ = (float)local_6c0._4_4_ * fVar268;
    auVar120._0_4_ = (float)local_6c0._0_4_ * fVar259;
    auVar120._8_4_ = fStack_6b8 * fVar163;
    auVar120._12_4_ = fStack_6b4 * fVar255;
    auVar120._16_4_ = fStack_6b0 * fVar256;
    auVar120._20_4_ = fStack_6ac * fVar257;
    auVar120._24_4_ = fStack_6a8 * fVar258;
    auVar120._28_4_ = auVar222._28_4_;
    auVar110 = vmulps_avx512vl(local_6e0,auVar115);
    auVar138._4_4_ = uStack_61c;
    auVar138._0_4_ = local_620;
    auVar138._8_4_ = uStack_618;
    auVar138._12_4_ = uStack_614;
    auVar138._16_4_ = uStack_610;
    auVar138._20_4_ = uStack_60c;
    auVar138._24_4_ = uStack_608;
    auVar138._28_4_ = uStack_604;
    auVar115 = vfmadd231ps_avx512vl(auVar118,auVar114,auVar138);
    auVar116 = vfmadd231ps_avx512vl(auVar119,auVar114,local_640);
    auVar117 = vfmadd231ps_avx512vl(auVar120,auVar114,local_660);
    auVar97 = vfmadd231ps_fma(auVar110,local_680,auVar114);
    auVar139._4_4_ = uStack_59c;
    auVar139._0_4_ = local_5a0;
    auVar139._8_4_ = uStack_598;
    auVar139._12_4_ = uStack_594;
    auVar139._16_4_ = uStack_590;
    auVar139._20_4_ = uStack_58c;
    auVar139._24_4_ = uStack_588;
    auVar139._28_4_ = uStack_584;
    auVar110 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar139);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar113,local_5c0);
    auVar114 = vfmadd231ps_avx512vl(auVar117,auVar113,local_5e0);
    auVar116 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),local_600,auVar113);
    auVar76._4_4_ = uStack_51c;
    auVar76._0_4_ = local_520;
    auVar76._8_4_ = uStack_518;
    auVar76._12_4_ = uStack_514;
    auVar75._16_4_ = uStack_510;
    auVar75._0_16_ = auVar76;
    auVar75._20_4_ = uStack_50c;
    auVar75._24_4_ = uStack_508;
    auVar75._28_4_ = uStack_504;
    local_b00 = vfmadd231ps_avx512vl(auVar110,auVar111,auVar75);
    local_8e0 = vfmadd231ps_avx512vl(auVar115,auVar111,local_540);
    local_ae0 = vfmadd231ps_avx512vl(auVar114,auVar111,local_560);
    auVar115 = vfmadd231ps_avx512vl(auVar116,local_580,auVar111);
    fVar259 = auVar109._28_4_;
    auVar121._4_4_ = (fVar277 + fVar277) * fVar265;
    auVar121._0_4_ = (fVar270 + fVar270) * fVar264;
    auVar121._8_4_ = (fVar278 + fVar278) * fVar266;
    auVar121._12_4_ = (fVar279 + fVar279) * fVar267;
    auVar121._16_4_ = (fVar280 + fVar280) * 0.0;
    auVar121._20_4_ = (fVar281 + fVar281) * 0.0;
    auVar121._24_4_ = (fVar282 + fVar282) * 0.0;
    auVar121._28_4_ = auVar113._28_4_;
    auVar109 = vsubps_avx(auVar121,auVar186._0_32_);
    auVar248._0_28_ =
         ZEXT1628(CONCAT412((fVar267 + fVar267) * (fVar291 + -5.0) + fVar291 * fVar267,
                            CONCAT48((fVar266 + fVar266) * (fVar290 + -5.0) + fVar290 * fVar266,
                                     CONCAT44((fVar265 + fVar265) * (fVar289 + -5.0) +
                                              fVar289 * fVar265,
                                              (fVar264 + fVar264) * (fVar286 + -5.0) +
                                              fVar286 * fVar264))));
    auVar248._28_4_ = fVar293 + 0.0;
    auVar111._8_4_ = 0x40000000;
    auVar111._0_8_ = 0x4000000040000000;
    auVar111._12_4_ = 0x40000000;
    auVar111._16_4_ = 0x40000000;
    auVar111._20_4_ = 0x40000000;
    auVar111._24_4_ = 0x40000000;
    auVar111._28_4_ = 0x40000000;
    auVar110 = vaddps_avx512vl(auVar304._0_32_,auVar111);
    auVar122._4_4_ = (fVar277 + fVar277) * auVar110._4_4_;
    auVar122._0_4_ = (fVar270 + fVar270) * auVar110._0_4_;
    auVar122._8_4_ = (fVar278 + fVar278) * auVar110._8_4_;
    auVar122._12_4_ = (fVar279 + fVar279) * auVar110._12_4_;
    auVar122._16_4_ = (fVar280 + fVar280) * auVar110._16_4_;
    auVar122._20_4_ = (fVar281 + fVar281) * auVar110._20_4_;
    auVar122._24_4_ = (fVar282 + fVar282) * auVar110._24_4_;
    auVar122._28_4_ = auVar110._28_4_;
    auVar123._4_4_ = fVar277 * 3.0 * fVar277;
    auVar123._0_4_ = fVar270 * 3.0 * fVar270;
    auVar123._8_4_ = fVar278 * 3.0 * fVar278;
    auVar123._12_4_ = fVar279 * 3.0 * fVar279;
    auVar123._16_4_ = fVar280 * 3.0 * fVar280;
    auVar123._20_4_ = fVar281 * 3.0 * fVar281;
    auVar123._24_4_ = fVar282 * 3.0 * fVar282;
    auVar123._28_4_ = fVar259;
    auVar110 = vsubps_avx(auVar122,auVar123);
    auVar111 = vsubps_avx(auVar292._0_32_,auVar121);
    auVar109 = vmulps_avx512vl(auVar109,auVar112);
    auVar113 = vmulps_avx512vl(auVar248,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar112);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    fVar264 = auVar111._0_4_;
    fVar265 = auVar111._4_4_;
    auVar126._4_4_ = fVar265 * (float)local_7a0._4_4_;
    auVar126._0_4_ = fVar264 * (float)local_7a0._0_4_;
    fVar266 = auVar111._8_4_;
    auVar126._8_4_ = fVar266 * fStack_798;
    fVar267 = auVar111._12_4_;
    auVar126._12_4_ = fVar267 * fStack_794;
    fVar268 = auVar111._16_4_;
    auVar126._16_4_ = fVar268 * fStack_790;
    fVar163 = auVar111._20_4_;
    auVar126._20_4_ = fVar163 * fStack_78c;
    fVar255 = auVar111._24_4_;
    auVar126._24_4_ = fVar255 * fStack_788;
    auVar126._28_4_ = fVar293;
    auVar127._4_4_ = (float)local_6a0._4_4_ * fVar265;
    auVar127._0_4_ = (float)local_6a0._0_4_ * fVar264;
    auVar127._8_4_ = fStack_698 * fVar266;
    auVar127._12_4_ = fStack_694 * fVar267;
    auVar127._16_4_ = fStack_690 * fVar268;
    auVar127._20_4_ = fStack_68c * fVar163;
    auVar127._24_4_ = fStack_688 * fVar255;
    auVar127._28_4_ = uStack_684;
    auVar128._4_4_ = fVar265 * (float)local_6c0._4_4_;
    auVar128._0_4_ = fVar264 * (float)local_6c0._0_4_;
    auVar128._8_4_ = fVar266 * fStack_6b8;
    auVar128._12_4_ = fVar267 * fStack_6b4;
    auVar128._16_4_ = fVar268 * fStack_6b0;
    auVar128._20_4_ = fVar163 * fStack_6ac;
    auVar128._24_4_ = fVar255 * fStack_6a8;
    auVar128._28_4_ = fVar259 + fVar259;
    auVar111 = vmulps_avx512vl(local_6e0,auVar111);
    auVar112 = vfmadd231ps_avx512vl(auVar126,auVar110,auVar138);
    auVar114 = vfmadd231ps_avx512vl(auVar127,auVar110,local_640);
    auVar116 = vfmadd231ps_avx512vl(auVar128,auVar110,local_660);
    auVar97 = vfmadd231ps_fma(auVar111,local_680,auVar110);
    auVar110 = vfmadd231ps_avx512vl(auVar112,auVar113,auVar139);
    auVar111 = vfmadd231ps_avx512vl(auVar114,auVar113,local_5c0);
    auVar112 = vfmadd231ps_avx512vl(auVar116,auVar113,local_5e0);
    auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),local_600,auVar113);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar75);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,local_540);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_560);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_580,auVar109);
    auVar135._4_4_ = auVar110._4_4_ * fVar269;
    auVar135._0_4_ = auVar110._0_4_ * fVar269;
    auVar135._8_4_ = auVar110._8_4_ * fVar269;
    auVar135._12_4_ = auVar110._12_4_ * fVar269;
    auVar135._16_4_ = auVar110._16_4_ * fVar269;
    auVar135._20_4_ = auVar110._20_4_ * fVar269;
    auVar135._24_4_ = auVar110._24_4_ * fVar269;
    auVar135._28_4_ = auVar109._28_4_;
    auVar136._4_4_ = auVar111._4_4_ * fVar269;
    auVar136._0_4_ = auVar111._0_4_ * fVar269;
    auVar136._8_4_ = auVar111._8_4_ * fVar269;
    auVar136._12_4_ = auVar111._12_4_ * fVar269;
    auVar136._16_4_ = auVar111._16_4_ * fVar269;
    auVar136._20_4_ = auVar111._20_4_ * fVar269;
    auVar136._24_4_ = auVar111._24_4_ * fVar269;
    auVar136._28_4_ = auVar111._28_4_;
    auVar137._4_4_ = auVar112._4_4_ * fVar269;
    auVar137._0_4_ = auVar112._0_4_ * fVar269;
    auVar137._8_4_ = auVar112._8_4_ * fVar269;
    auVar137._12_4_ = auVar112._12_4_ * fVar269;
    auVar137._16_4_ = auVar112._16_4_ * fVar269;
    auVar137._20_4_ = auVar112._20_4_ * fVar269;
    auVar137._24_4_ = auVar112._24_4_ * fVar269;
    auVar137._28_4_ = auVar112._28_4_;
    fVar259 = auVar113._0_4_ * fVar269;
    fVar264 = auVar113._4_4_ * fVar269;
    auVar129._4_4_ = fVar264;
    auVar129._0_4_ = fVar259;
    fVar265 = auVar113._8_4_ * fVar269;
    auVar129._8_4_ = fVar265;
    fVar266 = auVar113._12_4_ * fVar269;
    auVar129._12_4_ = fVar266;
    fVar267 = auVar113._16_4_ * fVar269;
    auVar129._16_4_ = fVar267;
    fVar268 = auVar113._20_4_ * fVar269;
    auVar129._20_4_ = fVar268;
    fVar269 = auVar113._24_4_ * fVar269;
    auVar129._24_4_ = fVar269;
    auVar129._28_4_ = fStack_6a4;
    auVar118 = vpermt2ps_avx512vl(local_b00,_DAT_0205fd20,ZEXT832(0) << 0x20);
    auVar285 = ZEXT3264(auVar118);
    auVar119 = vpermt2ps_avx512vl(local_8e0,_DAT_0205fd20,ZEXT832(0) << 0x20);
    auVar120 = vpermt2ps_avx512vl(local_ae0,_DAT_0205fd20,ZEXT832(0) << 0x20);
    auVar249._0_4_ = auVar115._0_4_ + fVar259;
    auVar249._4_4_ = auVar115._4_4_ + fVar264;
    auVar249._8_4_ = auVar115._8_4_ + fVar265;
    auVar249._12_4_ = auVar115._12_4_ + fVar266;
    auVar249._16_4_ = auVar115._16_4_ + fVar267;
    auVar249._20_4_ = auVar115._20_4_ + fVar268;
    auVar249._24_4_ = auVar115._24_4_ + fVar269;
    auVar249._28_4_ = auVar115._28_4_ + fStack_6a4;
    auVar109 = vmaxps_avx(auVar115,auVar249);
    auVar110 = vminps_avx(auVar115,auVar249);
    auVar114 = vpermt2ps_avx512vl(auVar115,_DAT_0205fd20,ZEXT832(0) << 0x20);
    auVar121 = vpermt2ps_avx512vl(auVar135,_DAT_0205fd20,ZEXT832(0) << 0x20);
    auVar111 = ZEXT832(0) << 0x20;
    auVar122 = vpermt2ps_avx512vl(auVar136,_DAT_0205fd20,auVar111);
    auVar123 = vpermt2ps_avx512vl(auVar137,_DAT_0205fd20,auVar111);
    auVar111 = vpermt2ps_avx512vl(auVar129,_DAT_0205fd20,auVar111);
    auVar97 = vxorps_avx512vl(auVar76,auVar76);
    auVar116 = vsubps_avx512vl(auVar114,auVar111);
    auVar111 = vsubps_avx(auVar118,local_b00);
    auVar113 = vsubps_avx(auVar119,local_8e0);
    auVar115 = vsubps_avx(auVar120,local_ae0);
    auVar112 = vmulps_avx512vl(auVar113,auVar137);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar136,auVar115);
    auVar117 = vmulps_avx512vl(auVar115,auVar135);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar137,auVar111);
    auVar124 = vmulps_avx512vl(auVar111,auVar136);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar135,auVar113);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar117 = vfmadd231ps_avx512vl(auVar124,auVar117,auVar117);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar112,auVar112);
    auVar112 = vmulps_avx512vl(auVar115,auVar115);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar113,auVar113);
    auVar124 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = &DAT_3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar112 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar112);
    auVar112 = vfmadd132ps_avx512vl(auVar112,auVar125,auVar125);
    auVar117 = vmulps_avx512vl(auVar117,auVar112);
    auVar125 = vmulps_avx512vl(auVar113,auVar123);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar122,auVar115);
    auVar126 = vmulps_avx512vl(auVar115,auVar121);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar123,auVar111);
    auVar127 = vmulps_avx512vl(auVar111,auVar122);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar121,auVar113);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar112 = vmulps_avx512vl(auVar125,auVar112);
    auVar112 = vmaxps_avx512vl(auVar117,auVar112);
    auVar112 = vsqrtps_avx512vl(auVar112);
    auVar117 = vmaxps_avx512vl(auVar116,auVar114);
    auVar109 = vmaxps_avx512vl(auVar109,auVar117);
    auVar117 = vaddps_avx512vl(auVar112,auVar109);
    auVar109 = vminps_avx512vl(auVar116,auVar114);
    auVar109 = vminps_avx(auVar110,auVar109);
    auVar109 = vsubps_avx512vl(auVar109,auVar112);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar110 = vmulps_avx512vl(auVar117,auVar114);
    auVar116._8_4_ = 0x3f7ffffc;
    auVar116._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar116._12_4_ = 0x3f7ffffc;
    auVar116._16_4_ = 0x3f7ffffc;
    auVar116._20_4_ = 0x3f7ffffc;
    auVar116._24_4_ = 0x3f7ffffc;
    auVar116._28_4_ = 0x3f7ffffc;
    auVar112 = vmulps_avx512vl(auVar109,auVar116);
    auVar238 = ZEXT3264(auVar112);
    auVar130._4_4_ = auVar110._4_4_ * auVar110._4_4_;
    auVar130._0_4_ = auVar110._0_4_ * auVar110._0_4_;
    auVar130._8_4_ = auVar110._8_4_ * auVar110._8_4_;
    auVar130._12_4_ = auVar110._12_4_ * auVar110._12_4_;
    auVar130._16_4_ = auVar110._16_4_ * auVar110._16_4_;
    auVar130._20_4_ = auVar110._20_4_ * auVar110._20_4_;
    auVar130._24_4_ = auVar110._24_4_ * auVar110._24_4_;
    auVar130._28_4_ = auVar109._28_4_;
    auVar109 = vrsqrt14ps_avx512vl(auVar124);
    auVar117._8_4_ = 0xbf000000;
    auVar117._0_8_ = 0xbf000000bf000000;
    auVar117._12_4_ = 0xbf000000;
    auVar117._16_4_ = 0xbf000000;
    auVar117._20_4_ = 0xbf000000;
    auVar117._24_4_ = 0xbf000000;
    auVar117._28_4_ = 0xbf000000;
    auVar110 = vmulps_avx512vl(auVar124,auVar117);
    auVar131._4_4_ = auVar109._4_4_ * auVar110._4_4_;
    auVar131._0_4_ = auVar109._0_4_ * auVar110._0_4_;
    auVar131._8_4_ = auVar109._8_4_ * auVar110._8_4_;
    auVar131._12_4_ = auVar109._12_4_ * auVar110._12_4_;
    auVar131._16_4_ = auVar109._16_4_ * auVar110._16_4_;
    auVar131._20_4_ = auVar109._20_4_ * auVar110._20_4_;
    auVar131._24_4_ = auVar109._24_4_ * auVar110._24_4_;
    auVar131._28_4_ = auVar110._28_4_;
    auVar110 = vmulps_avx512vl(auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar110,auVar131);
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar114 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar124);
    auVar132._4_4_ = auVar114._4_4_ * auVar111._4_4_;
    auVar132._0_4_ = auVar114._0_4_ * auVar111._0_4_;
    auVar132._8_4_ = auVar114._8_4_ * auVar111._8_4_;
    auVar132._12_4_ = auVar114._12_4_ * auVar111._12_4_;
    auVar132._16_4_ = auVar114._16_4_ * auVar111._16_4_;
    auVar132._20_4_ = auVar114._20_4_ * auVar111._20_4_;
    auVar132._24_4_ = auVar114._24_4_ * auVar111._24_4_;
    auVar132._28_4_ = auVar109._28_4_;
    auVar116 = vmulps_avx512vl(auVar113,auVar114);
    auVar109 = vmulps_avx512vl(auVar115,auVar114);
    auVar117 = vsubps_avx512vl(ZEXT1632(auVar97),local_b00);
    auVar124 = vsubps_avx512vl(ZEXT1632(auVar97),local_8e0);
    auVar126 = vsubps_avx512vl(ZEXT1632(auVar97),local_ae0);
    auVar110 = vmulps_avx512vl(auVar303._0_32_,auVar126);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar124);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar117);
    auVar125 = vmulps_avx512vl(auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar125 = vfmadd231ps_avx512vl(auVar125,auVar117,auVar117);
    auVar127 = vmulps_avx512vl(auVar303._0_32_,auVar109);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar116,auVar107);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar132,auVar106);
    auVar109 = vmulps_avx512vl(auVar126,auVar109);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar124,auVar116);
    auVar128 = vfmadd231ps_avx512vl(auVar109,auVar117,auVar132);
    local_920 = vmulps_avx512vl(auVar127,auVar127);
    auVar109 = vsubps_avx(local_700,local_920);
    auVar129 = vmulps_avx512vl(auVar127,auVar128);
    auVar110 = vsubps_avx512vl(auVar110,auVar129);
    auVar129 = vaddps_avx512vl(auVar110,auVar110);
    auVar110 = vmulps_avx512vl(auVar128,auVar128);
    local_900 = vsubps_avx512vl(auVar125,auVar110);
    auVar297 = ZEXT3264(local_900);
    auVar110 = vsubps_avx(local_900,auVar130);
    auVar130 = vmulps_avx512vl(auVar129,auVar129);
    auVar125._8_4_ = 0x40800000;
    auVar125._0_8_ = 0x4080000040800000;
    auVar125._12_4_ = 0x40800000;
    auVar125._16_4_ = 0x40800000;
    auVar125._20_4_ = 0x40800000;
    auVar125._24_4_ = 0x40800000;
    auVar125._28_4_ = 0x40800000;
    auVar125 = vmulps_avx512vl(auVar109,auVar125);
    auVar131 = vmulps_avx512vl(auVar125,auVar110);
    auVar131 = vsubps_avx512vl(auVar130,auVar131);
    auVar98 = vxorps_avx512vl(auVar116._0_16_,auVar116._0_16_);
    uVar89 = vcmpps_avx512vl(auVar131,ZEXT1632(auVar97),5);
    bVar82 = (byte)uVar89;
    if (bVar82 == 0) {
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar116 = vsqrtps_avx512vl(auVar131);
      auVar131 = vaddps_avx512vl(auVar109,auVar109);
      auVar132 = vrcp14ps_avx512vl(auVar131);
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = &DAT_3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar35._16_4_ = 0x3f800000;
      auVar35._20_4_ = 0x3f800000;
      auVar35._24_4_ = 0x3f800000;
      auVar35._28_4_ = 0x3f800000;
      auVar131 = vfnmadd213ps_avx512vl(auVar131,auVar132,auVar35);
      auVar131 = vfmadd132ps_avx512vl(auVar131,auVar132,auVar132);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      auVar132 = vxorps_avx512vl(auVar129,auVar36);
      auVar132 = vsubps_avx512vl(auVar132,auVar116);
      auVar132 = vmulps_avx512vl(auVar132,auVar131);
      auVar116 = vsubps_avx512vl(auVar116,auVar129);
      auVar116 = vmulps_avx512vl(auVar116,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar127,auVar132,auVar128);
      local_820 = vmulps_avx512vl(auVar114,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar127,auVar116,auVar128);
      local_840 = vmulps_avx512vl(auVar114,auVar131);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar131,auVar132);
      auVar133._0_4_ =
           (uint)(bVar82 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar82 & 1) * local_840._0_4_;
      bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar9 * auVar131._4_4_ | (uint)!bVar9 * local_840._4_4_;
      bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar9 * auVar131._8_4_ | (uint)!bVar9 * local_840._8_4_;
      bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar9 * auVar131._12_4_ | (uint)!bVar9 * local_840._12_4_;
      bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar9 * auVar131._16_4_ | (uint)!bVar9 * local_840._16_4_;
      bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar9 * auVar131._20_4_ | (uint)!bVar9 * local_840._20_4_;
      bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar9 * auVar131._24_4_ | (uint)!bVar9 * local_840._24_4_;
      bVar9 = SUB81(uVar89 >> 7,0);
      auVar133._28_4_ = (uint)bVar9 * auVar131._28_4_ | (uint)!bVar9 * local_840._28_4_;
      auVar234._8_4_ = 0xff800000;
      auVar234._0_8_ = 0xff800000ff800000;
      auVar234._12_4_ = 0xff800000;
      auVar234._16_4_ = 0xff800000;
      auVar234._20_4_ = 0xff800000;
      auVar234._24_4_ = 0xff800000;
      auVar234._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar234,auVar116);
      auVar134._0_4_ =
           (uint)(bVar82 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar116._0_4_;
      bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar9 * auVar131._4_4_ | (uint)!bVar9 * auVar116._4_4_;
      bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar9 * auVar131._8_4_ | (uint)!bVar9 * auVar116._8_4_;
      bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar9 * auVar131._12_4_ | (uint)!bVar9 * auVar116._12_4_;
      bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar9 * auVar131._16_4_ | (uint)!bVar9 * auVar116._16_4_;
      bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar9 * auVar131._20_4_ | (uint)!bVar9 * auVar116._20_4_;
      bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar9 * auVar131._24_4_ | (uint)!bVar9 * auVar116._24_4_;
      bVar9 = SUB81(uVar89 >> 7,0);
      auVar134._28_4_ = (uint)bVar9 * auVar131._28_4_ | (uint)!bVar9 * auVar116._28_4_;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_920,auVar131);
      auVar116 = vmaxps_avx(local_7c0,auVar131);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      auVar116 = vmulps_avx512vl(auVar116,auVar37);
      auVar238 = ZEXT3264(auVar116);
      vandps_avx512vl(auVar109,auVar131);
      uVar86 = vcmpps_avx512vl(auVar116,auVar116,1);
      uVar89 = uVar89 & uVar86;
      bVar84 = (byte)uVar89;
      if (bVar84 != 0) {
        uVar86 = vcmpps_avx512vl(auVar110,ZEXT1632(auVar98),2);
        auVar250._8_4_ = 0xff800000;
        auVar250._0_8_ = 0xff800000ff800000;
        auVar250._12_4_ = 0xff800000;
        auVar250._16_4_ = 0xff800000;
        auVar250._20_4_ = 0xff800000;
        auVar250._24_4_ = 0xff800000;
        auVar250._28_4_ = 0xff800000;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar131 = vblendmps_avx512vl(auVar110,auVar250);
        bVar80 = (byte)uVar86;
        uVar90 = (uint)(bVar80 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar116._0_4_;
        bVar9 = (bool)((byte)(uVar86 >> 1) & 1);
        uVar155 = (uint)bVar9 * auVar131._4_4_ | (uint)!bVar9 * auVar116._4_4_;
        bVar9 = (bool)((byte)(uVar86 >> 2) & 1);
        uVar156 = (uint)bVar9 * auVar131._8_4_ | (uint)!bVar9 * auVar116._8_4_;
        bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
        uVar157 = (uint)bVar9 * auVar131._12_4_ | (uint)!bVar9 * auVar116._12_4_;
        bVar9 = (bool)((byte)(uVar86 >> 4) & 1);
        uVar158 = (uint)bVar9 * auVar131._16_4_ | (uint)!bVar9 * auVar116._16_4_;
        bVar9 = (bool)((byte)(uVar86 >> 5) & 1);
        uVar159 = (uint)bVar9 * auVar131._20_4_ | (uint)!bVar9 * auVar116._20_4_;
        bVar9 = (bool)((byte)(uVar86 >> 6) & 1);
        uVar160 = (uint)bVar9 * auVar131._24_4_ | (uint)!bVar9 * auVar116._24_4_;
        bVar9 = SUB81(uVar86 >> 7,0);
        uVar161 = (uint)bVar9 * auVar131._28_4_ | (uint)!bVar9 * auVar116._28_4_;
        auVar133._0_4_ = (bVar84 & 1) * uVar90 | !(bool)(bVar84 & 1) * auVar133._0_4_;
        bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar133._4_4_ = bVar9 * uVar155 | !bVar9 * auVar133._4_4_;
        bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar133._8_4_ = bVar9 * uVar156 | !bVar9 * auVar133._8_4_;
        bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar133._12_4_ = bVar9 * uVar157 | !bVar9 * auVar133._12_4_;
        bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar133._16_4_ = bVar9 * uVar158 | !bVar9 * auVar133._16_4_;
        bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar133._20_4_ = bVar9 * uVar159 | !bVar9 * auVar133._20_4_;
        bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar133._24_4_ = bVar9 * uVar160 | !bVar9 * auVar133._24_4_;
        bVar9 = SUB81(uVar89 >> 7,0);
        auVar133._28_4_ = bVar9 * uVar161 | !bVar9 * auVar133._28_4_;
        auVar110 = vblendmps_avx512vl(auVar250,auVar110);
        uVar90 = (uint)(bVar80 & 1) * auVar110._0_4_ | !(bool)(bVar80 & 1) * uVar90;
        bVar9 = (bool)((byte)(uVar86 >> 1) & 1);
        uVar155 = (uint)bVar9 * auVar110._4_4_ | !bVar9 * uVar155;
        bVar9 = (bool)((byte)(uVar86 >> 2) & 1);
        uVar156 = (uint)bVar9 * auVar110._8_4_ | !bVar9 * uVar156;
        bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
        uVar157 = (uint)bVar9 * auVar110._12_4_ | !bVar9 * uVar157;
        bVar9 = (bool)((byte)(uVar86 >> 4) & 1);
        uVar158 = (uint)bVar9 * auVar110._16_4_ | !bVar9 * uVar158;
        bVar9 = (bool)((byte)(uVar86 >> 5) & 1);
        uVar159 = (uint)bVar9 * auVar110._20_4_ | !bVar9 * uVar159;
        bVar9 = (bool)((byte)(uVar86 >> 6) & 1);
        uVar160 = (uint)bVar9 * auVar110._24_4_ | !bVar9 * uVar160;
        bVar9 = SUB81(uVar86 >> 7,0);
        uVar161 = (uint)bVar9 * auVar110._28_4_ | !bVar9 * uVar161;
        auVar238 = ZEXT3264(CONCAT428(uVar161,CONCAT424(uVar160,CONCAT420(uVar159,CONCAT416(uVar158,
                                                  CONCAT412(uVar157,CONCAT48(uVar156,CONCAT44(
                                                  uVar155,uVar90))))))));
        auVar134._0_4_ = (bVar84 & 1) * uVar90 | !(bool)(bVar84 & 1) * auVar134._0_4_;
        bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar134._4_4_ = bVar9 * uVar155 | !bVar9 * auVar134._4_4_;
        bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar134._8_4_ = bVar9 * uVar156 | !bVar9 * auVar134._8_4_;
        bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar134._12_4_ = bVar9 * uVar157 | !bVar9 * auVar134._12_4_;
        bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar134._16_4_ = bVar9 * uVar158 | !bVar9 * auVar134._16_4_;
        bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar134._20_4_ = bVar9 * uVar159 | !bVar9 * auVar134._20_4_;
        bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar134._24_4_ = bVar9 * uVar160 | !bVar9 * auVar134._24_4_;
        bVar9 = SUB81(uVar89 >> 7,0);
        auVar134._28_4_ = bVar9 * uVar161 | !bVar9 * auVar134._28_4_;
        bVar82 = (~bVar84 | bVar80) & bVar82;
      }
    }
    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar302 = ZEXT3264(auVar110);
    if ((bVar82 & 0x7f) == 0) {
      auVar186 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar292 = ZEXT3264(_DAT_02020f20);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar304 = ZEXT3264(auVar109);
      auVar303 = ZEXT3264(local_aa0);
    }
    else {
      fVar259 = *(float *)(ray + k * 4 + 0x200) - (float)local_9b0._0_4_;
      auVar235._4_4_ = fVar259;
      auVar235._0_4_ = fVar259;
      auVar235._8_4_ = fVar259;
      auVar235._12_4_ = fVar259;
      auVar235._16_4_ = fVar259;
      auVar235._20_4_ = fVar259;
      auVar235._24_4_ = fVar259;
      auVar235._28_4_ = fVar259;
      auVar131 = vminps_avx512vl(auVar235,auVar134);
      auVar74._4_4_ = fStack_71c;
      auVar74._0_4_ = local_720;
      auVar74._8_4_ = fStack_718;
      auVar74._12_4_ = fStack_714;
      auVar74._16_4_ = fStack_710;
      auVar74._20_4_ = fStack_70c;
      auVar74._24_4_ = fStack_708;
      auVar74._28_4_ = fStack_704;
      auVar116 = vmaxps_avx512vl(auVar74,auVar133);
      auVar126 = vmulps_avx512vl(auVar126,auVar137);
      auVar124 = vfmadd213ps_avx512vl(auVar124,auVar136,auVar126);
      auVar117 = vfmadd213ps_avx512vl(auVar117,auVar135,auVar124);
      auVar303 = ZEXT3264(local_aa0);
      auVar124 = vmulps_avx512vl(local_aa0,auVar137);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar107,auVar136);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar106,auVar135);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar124,auVar126);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar24 = vcmpps_avx512vl(auVar126,auVar135,1);
      auVar117 = vxorps_avx512vl(auVar117,auVar110);
      auVar136 = vrcp14ps_avx512vl(auVar124);
      auVar137 = vxorps_avx512vl(auVar124,auVar110);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar304 = ZEXT3264(auVar132);
      auVar138 = vfnmadd213ps_avx512vl(auVar136,auVar124,auVar132);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar136,auVar136);
      auVar117 = vmulps_avx512vl(auVar138,auVar117);
      uVar25 = vcmpps_avx512vl(auVar124,auVar137,1);
      bVar84 = (byte)uVar24 | (byte)uVar25;
      auVar138 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar139 = vblendmps_avx512vl(auVar117,auVar138);
      auVar140._0_4_ =
           (uint)(bVar84 & 1) * auVar139._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar136._0_4_;
      bVar9 = (bool)(bVar84 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar9 * auVar139._4_4_ | (uint)!bVar9 * auVar136._4_4_;
      bVar9 = (bool)(bVar84 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar9 * auVar139._8_4_ | (uint)!bVar9 * auVar136._8_4_;
      bVar9 = (bool)(bVar84 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar9 * auVar139._12_4_ | (uint)!bVar9 * auVar136._12_4_;
      bVar9 = (bool)(bVar84 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar9 * auVar139._16_4_ | (uint)!bVar9 * auVar136._16_4_;
      bVar9 = (bool)(bVar84 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar9 * auVar139._20_4_ | (uint)!bVar9 * auVar136._20_4_;
      bVar9 = (bool)(bVar84 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar9 * auVar139._24_4_ | (uint)!bVar9 * auVar136._24_4_;
      auVar140._28_4_ =
           (uint)(bVar84 >> 7) * auVar139._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar136._28_4_;
      auVar116 = vmaxps_avx(auVar116,auVar140);
      uVar25 = vcmpps_avx512vl(auVar124,auVar137,6);
      bVar84 = (byte)uVar24 | (byte)uVar25;
      auVar136 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar141._0_4_ =
           (uint)(bVar84 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar117._0_4_;
      bVar9 = (bool)(bVar84 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar9 * auVar136._4_4_ | (uint)!bVar9 * auVar117._4_4_;
      bVar9 = (bool)(bVar84 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar9 * auVar136._8_4_ | (uint)!bVar9 * auVar117._8_4_;
      bVar9 = (bool)(bVar84 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar9 * auVar136._12_4_ | (uint)!bVar9 * auVar117._12_4_;
      bVar9 = (bool)(bVar84 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar9 * auVar136._16_4_ | (uint)!bVar9 * auVar117._16_4_;
      bVar9 = (bool)(bVar84 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar9 * auVar136._20_4_ | (uint)!bVar9 * auVar117._20_4_;
      bVar9 = (bool)(bVar84 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar9 * auVar136._24_4_ | (uint)!bVar9 * auVar117._24_4_;
      auVar141._28_4_ =
           (uint)(bVar84 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar117._28_4_;
      auVar117 = vminps_avx(auVar131,auVar141);
      auVar238 = ZEXT3264(auVar117);
      auVar124 = vsubps_avx(ZEXT832(0) << 0x20,auVar118);
      auVar118 = vsubps_avx(ZEXT832(0) << 0x20,auVar119);
      auVar137 = ZEXT832(0) << 0x20;
      auVar119 = vsubps_avx(auVar137,auVar120);
      auVar46._4_4_ = auVar119._4_4_ * auVar123._4_4_;
      auVar46._0_4_ = auVar119._0_4_ * auVar123._0_4_;
      auVar46._8_4_ = auVar119._8_4_ * auVar123._8_4_;
      auVar46._12_4_ = auVar119._12_4_ * auVar123._12_4_;
      auVar46._16_4_ = auVar119._16_4_ * auVar123._16_4_;
      auVar46._20_4_ = auVar119._20_4_ * auVar123._20_4_;
      auVar46._24_4_ = auVar119._24_4_ * auVar123._24_4_;
      auVar46._28_4_ = auVar119._28_4_;
      auVar118 = vfnmsub231ps_avx512vl(auVar46,auVar122,auVar118);
      auVar124 = vfnmadd231ps_avx512vl(auVar118,auVar121,auVar124);
      auVar118 = vmulps_avx512vl(local_aa0,auVar123);
      auVar118 = vfnmsub231ps_avx512vl(auVar118,auVar107,auVar122);
      auVar118 = vfnmadd231ps_avx512vl(auVar118,auVar106,auVar121);
      vandps_avx512vl(auVar118,auVar126);
      uVar24 = vcmpps_avx512vl(auVar118,auVar135,1);
      auVar124 = vxorps_avx512vl(auVar124,auVar110);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar120 = vxorps_avx512vl(auVar118,auVar110);
      auVar297 = ZEXT3264(auVar120);
      auVar121 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar132);
      auVar97 = vfmadd132ps_fma(auVar121,auVar119,auVar119);
      fVar259 = auVar97._0_4_ * auVar124._0_4_;
      fVar264 = auVar97._4_4_ * auVar124._4_4_;
      auVar47._4_4_ = fVar264;
      auVar47._0_4_ = fVar259;
      fVar265 = auVar97._8_4_ * auVar124._8_4_;
      auVar47._8_4_ = fVar265;
      fVar266 = auVar97._12_4_ * auVar124._12_4_;
      auVar47._12_4_ = fVar266;
      fVar267 = auVar124._16_4_ * 0.0;
      auVar47._16_4_ = fVar267;
      fVar269 = auVar124._20_4_ * 0.0;
      auVar47._20_4_ = fVar269;
      fVar268 = auVar124._24_4_ * 0.0;
      auVar47._24_4_ = fVar268;
      auVar47._28_4_ = auVar124._28_4_;
      uVar25 = vcmpps_avx512vl(auVar118,auVar120,1);
      bVar84 = (byte)uVar24 | (byte)uVar25;
      auVar121 = vblendmps_avx512vl(auVar47,auVar138);
      auVar142._0_4_ =
           (uint)(bVar84 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar119._0_4_;
      bVar9 = (bool)(bVar84 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar9 * auVar121._4_4_ | (uint)!bVar9 * auVar119._4_4_;
      bVar9 = (bool)(bVar84 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar9 * auVar121._8_4_ | (uint)!bVar9 * auVar119._8_4_;
      bVar9 = (bool)(bVar84 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar9 * auVar121._12_4_ | (uint)!bVar9 * auVar119._12_4_;
      bVar9 = (bool)(bVar84 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar9 * auVar121._16_4_ | (uint)!bVar9 * auVar119._16_4_;
      bVar9 = (bool)(bVar84 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar9 * auVar121._20_4_ | (uint)!bVar9 * auVar119._20_4_;
      bVar9 = (bool)(bVar84 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar9 * auVar121._24_4_ | (uint)!bVar9 * auVar119._24_4_;
      auVar142._28_4_ =
           (uint)(bVar84 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar119._28_4_;
      _local_960 = vmaxps_avx(auVar116,auVar142);
      uVar25 = vcmpps_avx512vl(auVar118,auVar120,6);
      bVar84 = (byte)uVar24 | (byte)uVar25;
      auVar143._0_4_ =
           (uint)(bVar84 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar259;
      bVar9 = (bool)(bVar84 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar9 * auVar136._4_4_ | (uint)!bVar9 * (int)fVar264;
      bVar9 = (bool)(bVar84 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar9 * auVar136._8_4_ | (uint)!bVar9 * (int)fVar265;
      bVar9 = (bool)(bVar84 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar9 * auVar136._12_4_ | (uint)!bVar9 * (int)fVar266;
      bVar9 = (bool)(bVar84 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar9 * auVar136._16_4_ | (uint)!bVar9 * (int)fVar267;
      bVar9 = (bool)(bVar84 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar9 * auVar136._20_4_ | (uint)!bVar9 * (int)fVar269;
      bVar9 = (bool)(bVar84 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar9 * auVar136._24_4_ | (uint)!bVar9 * (int)fVar268;
      auVar143._28_4_ =
           (uint)(bVar84 >> 7) * auVar136._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar124._28_4_;
      local_760 = vminps_avx(auVar117,auVar143);
      auVar285 = ZEXT3264(local_760);
      uVar24 = vcmpps_avx512vl(_local_960,local_760,2);
      bVar82 = bVar82 & 0x7f & (byte)uVar24;
      if (bVar82 == 0) {
        auVar186 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar292 = ZEXT3264(_DAT_02020f20);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar302 = ZEXT3264(auVar109);
      }
      else {
        auVar112 = vmaxps_avx(auVar137,auVar112);
        auVar116 = vminps_avx512vl(local_820,auVar132);
        auVar54 = ZEXT412(0);
        auVar117 = ZEXT1232(auVar54) << 0x20;
        auVar116 = vmaxps_avx(auVar116,ZEXT1232(auVar54) << 0x20);
        auVar124 = vminps_avx512vl(local_840,auVar132);
        auVar48._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar116._28_4_ + 7.0;
        auVar97 = vfmadd213ps_fma(auVar48,auVar176,auVar247);
        local_820 = ZEXT1632(auVar97);
        auVar116 = vmaxps_avx(auVar124,ZEXT1232(auVar54) << 0x20);
        auVar49._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar116._28_4_ + 7.0;
        auVar97 = vfmadd213ps_fma(auVar49,auVar176,auVar247);
        local_840 = ZEXT1632(auVar97);
        auVar236._0_4_ = auVar112._0_4_ * auVar112._0_4_;
        auVar236._4_4_ = auVar112._4_4_ * auVar112._4_4_;
        auVar236._8_4_ = auVar112._8_4_ * auVar112._8_4_;
        auVar236._12_4_ = auVar112._12_4_ * auVar112._12_4_;
        auVar236._16_4_ = auVar112._16_4_ * auVar112._16_4_;
        auVar236._20_4_ = auVar112._20_4_ * auVar112._20_4_;
        auVar236._24_4_ = auVar112._24_4_ * auVar112._24_4_;
        auVar236._28_4_ = 0;
        auVar112 = vsubps_avx(local_900,auVar236);
        auVar116 = vmulps_avx512vl(auVar125,auVar112);
        auVar116 = vsubps_avx512vl(auVar130,auVar116);
        uVar24 = vcmpps_avx512vl(auVar116,ZEXT1232(auVar54) << 0x20,5);
        bVar84 = (byte)uVar24;
        if (bVar84 == 0) {
          auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar238 = ZEXT864(0) << 0x20;
          auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar110 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar145._8_4_ = 0xff800000;
          auVar145._0_8_ = 0xff800000ff800000;
          auVar145._12_4_ = 0xff800000;
          auVar145._16_4_ = 0xff800000;
          auVar145._20_4_ = 0xff800000;
          auVar145._24_4_ = 0xff800000;
          auVar145._28_4_ = 0xff800000;
        }
        else {
          auVar98 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          uVar89 = vcmpps_avx512vl(auVar116,auVar137,5);
          auVar110 = vsqrtps_avx(auVar116);
          auVar251._0_4_ = auVar109._0_4_ + auVar109._0_4_;
          auVar251._4_4_ = auVar109._4_4_ + auVar109._4_4_;
          auVar251._8_4_ = auVar109._8_4_ + auVar109._8_4_;
          auVar251._12_4_ = auVar109._12_4_ + auVar109._12_4_;
          auVar251._16_4_ = auVar109._16_4_ + auVar109._16_4_;
          auVar251._20_4_ = auVar109._20_4_ + auVar109._20_4_;
          auVar251._24_4_ = auVar109._24_4_ + auVar109._24_4_;
          auVar251._28_4_ = auVar109._28_4_ + auVar109._28_4_;
          auVar116 = vrcp14ps_avx512vl(auVar251);
          auVar117 = vfnmadd213ps_avx512vl(auVar251,auVar116,auVar132);
          auVar97 = vfmadd132ps_fma(auVar117,auVar116,auVar116);
          auVar38._8_4_ = 0x80000000;
          auVar38._0_8_ = 0x8000000080000000;
          auVar38._12_4_ = 0x80000000;
          auVar38._16_4_ = 0x80000000;
          auVar38._20_4_ = 0x80000000;
          auVar38._24_4_ = 0x80000000;
          auVar38._28_4_ = 0x80000000;
          auVar116 = vxorps_avx512vl(auVar129,auVar38);
          auVar116 = vsubps_avx(auVar116,auVar110);
          auVar50._4_4_ = auVar116._4_4_ * auVar97._4_4_;
          auVar50._0_4_ = auVar116._0_4_ * auVar97._0_4_;
          auVar50._8_4_ = auVar116._8_4_ * auVar97._8_4_;
          auVar50._12_4_ = auVar116._12_4_ * auVar97._12_4_;
          auVar50._16_4_ = auVar116._16_4_ * 0.0;
          auVar50._20_4_ = auVar116._20_4_ * 0.0;
          auVar50._24_4_ = auVar116._24_4_ * 0.0;
          auVar50._28_4_ = 0x3e000000;
          auVar110 = vsubps_avx512vl(auVar110,auVar129);
          auVar300._0_4_ = auVar110._0_4_ * auVar97._0_4_;
          auVar300._4_4_ = auVar110._4_4_ * auVar97._4_4_;
          auVar300._8_4_ = auVar110._8_4_ * auVar97._8_4_;
          auVar300._12_4_ = auVar110._12_4_ * auVar97._12_4_;
          auVar300._16_4_ = auVar110._16_4_ * 0.0;
          auVar300._20_4_ = auVar110._20_4_ * 0.0;
          auVar300._24_4_ = auVar110._24_4_ * 0.0;
          auVar300._28_4_ = 0;
          auVar110 = vfmadd213ps_avx512vl(auVar127,auVar50,auVar128);
          auVar51._4_4_ = auVar114._4_4_ * auVar110._4_4_;
          auVar51._0_4_ = auVar114._0_4_ * auVar110._0_4_;
          auVar51._8_4_ = auVar114._8_4_ * auVar110._8_4_;
          auVar51._12_4_ = auVar114._12_4_ * auVar110._12_4_;
          auVar51._16_4_ = auVar114._16_4_ * auVar110._16_4_;
          auVar51._20_4_ = auVar114._20_4_ * auVar110._20_4_;
          auVar51._24_4_ = auVar114._24_4_ * auVar110._24_4_;
          auVar51._28_4_ = auVar116._28_4_;
          auVar110 = vmulps_avx512vl(auVar106,auVar50);
          auVar116 = vmulps_avx512vl(auVar107,auVar50);
          auVar117 = vmulps_avx512vl(local_aa0,auVar50);
          auVar124 = vfmadd213ps_avx512vl(auVar111,auVar51,local_b00);
          auVar110 = vsubps_avx512vl(auVar110,auVar124);
          auVar238 = ZEXT3264(auVar110);
          auVar110 = vfmadd213ps_avx512vl(auVar113,auVar51,local_8e0);
          auVar116 = vsubps_avx512vl(auVar116,auVar110);
          auVar97 = vfmadd213ps_fma(auVar51,auVar115,local_ae0);
          auVar110 = vsubps_avx(auVar117,ZEXT1632(auVar97));
          auVar117 = vfmadd213ps_avx512vl(auVar127,auVar300,auVar128);
          auVar114 = vmulps_avx512vl(auVar114,auVar117);
          auVar117 = vmulps_avx512vl(auVar106,auVar300);
          auVar124 = vmulps_avx512vl(auVar107,auVar300);
          auVar125 = vmulps_avx512vl(local_aa0,auVar300);
          auVar97 = vfmadd213ps_fma(auVar111,auVar114,local_b00);
          auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar113,auVar114,local_8e0);
          auVar111 = vsubps_avx512vl(auVar124,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar115,auVar114,local_ae0);
          auVar113 = vsubps_avx512vl(auVar125,ZEXT1632(auVar97));
          auVar177._8_4_ = 0x7f800000;
          auVar177._0_8_ = 0x7f8000007f800000;
          auVar177._12_4_ = 0x7f800000;
          auVar177._16_4_ = 0x7f800000;
          auVar177._20_4_ = 0x7f800000;
          auVar177._24_4_ = 0x7f800000;
          auVar177._28_4_ = 0x7f800000;
          auVar115 = vblendmps_avx512vl(auVar177,auVar50);
          bVar9 = (bool)((byte)uVar89 & 1);
          auVar144._0_4_ = (uint)bVar9 * auVar115._0_4_ | (uint)!bVar9 * local_ae0._0_4_;
          bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * local_ae0._4_4_;
          bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * local_ae0._8_4_;
          bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * local_ae0._12_4_;
          bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar144._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * local_ae0._16_4_;
          bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar144._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * local_ae0._20_4_;
          bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar144._24_4_ = (uint)bVar9 * auVar115._24_4_ | (uint)!bVar9 * local_ae0._24_4_;
          bVar9 = SUB81(uVar89 >> 7,0);
          auVar144._28_4_ = (uint)bVar9 * auVar115._28_4_ | (uint)!bVar9 * local_ae0._28_4_;
          auVar178._8_4_ = 0xff800000;
          auVar178._0_8_ = 0xff800000ff800000;
          auVar178._12_4_ = 0xff800000;
          auVar178._16_4_ = 0xff800000;
          auVar178._20_4_ = 0xff800000;
          auVar178._24_4_ = 0xff800000;
          auVar178._28_4_ = 0xff800000;
          auVar115 = vblendmps_avx512vl(auVar178,auVar300);
          bVar9 = (bool)((byte)uVar89 & 1);
          auVar145._0_4_ = (uint)bVar9 * auVar115._0_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar9 * auVar115._4_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar9 * auVar115._8_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar9 * auVar115._12_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar9 * auVar115._16_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar9 * auVar115._20_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar9 * auVar115._24_4_ | (uint)!bVar9 * -0x800000;
          bVar9 = SUB81(uVar89 >> 7,0);
          auVar145._28_4_ = (uint)bVar9 * auVar115._28_4_ | (uint)!bVar9 * -0x800000;
          auVar275._8_4_ = 0x7fffffff;
          auVar275._0_8_ = 0x7fffffff7fffffff;
          auVar275._12_4_ = 0x7fffffff;
          auVar275._16_4_ = 0x7fffffff;
          auVar275._20_4_ = 0x7fffffff;
          auVar275._24_4_ = 0x7fffffff;
          auVar275._28_4_ = 0x7fffffff;
          auVar115 = vandps_avx(auVar275,local_920);
          auVar115 = vmaxps_avx(local_7c0,auVar115);
          auVar39._8_4_ = 0x36000000;
          auVar39._0_8_ = 0x3600000036000000;
          auVar39._12_4_ = 0x36000000;
          auVar39._16_4_ = 0x36000000;
          auVar39._20_4_ = 0x36000000;
          auVar39._24_4_ = 0x36000000;
          auVar39._28_4_ = 0x36000000;
          auVar115 = vmulps_avx512vl(auVar115,auVar39);
          auVar109 = vandps_avx(auVar109,auVar275);
          uVar86 = vcmpps_avx512vl(auVar109,auVar115,1);
          uVar89 = uVar89 & uVar86;
          bVar80 = (byte)uVar89;
          if (bVar80 != 0) {
            uVar86 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar98),2);
            auVar276._8_4_ = 0xff800000;
            auVar276._0_8_ = 0xff800000ff800000;
            auVar276._12_4_ = 0xff800000;
            auVar276._16_4_ = 0xff800000;
            auVar276._20_4_ = 0xff800000;
            auVar276._24_4_ = 0xff800000;
            auVar276._28_4_ = 0xff800000;
            auVar296._8_4_ = 0x7f800000;
            auVar296._0_8_ = 0x7f8000007f800000;
            auVar296._12_4_ = 0x7f800000;
            auVar296._16_4_ = 0x7f800000;
            auVar296._20_4_ = 0x7f800000;
            auVar296._24_4_ = 0x7f800000;
            auVar296._28_4_ = 0x7f800000;
            auVar109 = vblendmps_avx512vl(auVar296,auVar276);
            bVar83 = (byte)uVar86;
            uVar90 = (uint)(bVar83 & 1) * auVar109._0_4_ |
                     (uint)!(bool)(bVar83 & 1) * auVar115._0_4_;
            bVar9 = (bool)((byte)(uVar86 >> 1) & 1);
            uVar155 = (uint)bVar9 * auVar109._4_4_ | (uint)!bVar9 * auVar115._4_4_;
            bVar9 = (bool)((byte)(uVar86 >> 2) & 1);
            uVar156 = (uint)bVar9 * auVar109._8_4_ | (uint)!bVar9 * auVar115._8_4_;
            bVar9 = (bool)((byte)(uVar86 >> 3) & 1);
            uVar157 = (uint)bVar9 * auVar109._12_4_ | (uint)!bVar9 * auVar115._12_4_;
            bVar9 = (bool)((byte)(uVar86 >> 4) & 1);
            uVar158 = (uint)bVar9 * auVar109._16_4_ | (uint)!bVar9 * auVar115._16_4_;
            bVar9 = (bool)((byte)(uVar86 >> 5) & 1);
            uVar159 = (uint)bVar9 * auVar109._20_4_ | (uint)!bVar9 * auVar115._20_4_;
            bVar9 = (bool)((byte)(uVar86 >> 6) & 1);
            uVar160 = (uint)bVar9 * auVar109._24_4_ | (uint)!bVar9 * auVar115._24_4_;
            bVar9 = SUB81(uVar86 >> 7,0);
            uVar161 = (uint)bVar9 * auVar109._28_4_ | (uint)!bVar9 * auVar115._28_4_;
            auVar144._0_4_ = (bVar80 & 1) * uVar90 | !(bool)(bVar80 & 1) * auVar144._0_4_;
            bVar9 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar144._4_4_ = bVar9 * uVar155 | !bVar9 * auVar144._4_4_;
            bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar144._8_4_ = bVar9 * uVar156 | !bVar9 * auVar144._8_4_;
            bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar144._12_4_ = bVar9 * uVar157 | !bVar9 * auVar144._12_4_;
            bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar144._16_4_ = bVar9 * uVar158 | !bVar9 * auVar144._16_4_;
            bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar144._20_4_ = bVar9 * uVar159 | !bVar9 * auVar144._20_4_;
            bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar144._24_4_ = bVar9 * uVar160 | !bVar9 * auVar144._24_4_;
            bVar9 = SUB81(uVar89 >> 7,0);
            auVar144._28_4_ = bVar9 * uVar161 | !bVar9 * auVar144._28_4_;
            auVar109 = vblendmps_avx512vl(auVar276,auVar296);
            bVar9 = (bool)((byte)(uVar86 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar86 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar86 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar86 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar86 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar86 >> 6) & 1);
            bVar15 = SUB81(uVar86 >> 7,0);
            auVar145._0_4_ =
                 (uint)(bVar80 & 1) *
                 ((uint)(bVar83 & 1) * auVar109._0_4_ | !(bool)(bVar83 & 1) * uVar90) |
                 !(bool)(bVar80 & 1) * auVar145._0_4_;
            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
            auVar145._4_4_ =
                 (uint)bVar88 * ((uint)bVar9 * auVar109._4_4_ | !bVar9 * uVar155) |
                 !bVar88 * auVar145._4_4_;
            bVar9 = (bool)((byte)(uVar89 >> 2) & 1);
            auVar145._8_4_ =
                 (uint)bVar9 * ((uint)bVar10 * auVar109._8_4_ | !bVar10 * uVar156) |
                 !bVar9 * auVar145._8_4_;
            bVar9 = (bool)((byte)(uVar89 >> 3) & 1);
            auVar145._12_4_ =
                 (uint)bVar9 * ((uint)bVar11 * auVar109._12_4_ | !bVar11 * uVar157) |
                 !bVar9 * auVar145._12_4_;
            bVar9 = (bool)((byte)(uVar89 >> 4) & 1);
            auVar145._16_4_ =
                 (uint)bVar9 * ((uint)bVar12 * auVar109._16_4_ | !bVar12 * uVar158) |
                 !bVar9 * auVar145._16_4_;
            bVar9 = (bool)((byte)(uVar89 >> 5) & 1);
            auVar145._20_4_ =
                 (uint)bVar9 * ((uint)bVar13 * auVar109._20_4_ | !bVar13 * uVar159) |
                 !bVar9 * auVar145._20_4_;
            bVar9 = (bool)((byte)(uVar89 >> 6) & 1);
            auVar145._24_4_ =
                 (uint)bVar9 * ((uint)bVar14 * auVar109._24_4_ | !bVar14 * uVar160) |
                 !bVar9 * auVar145._24_4_;
            bVar9 = SUB81(uVar89 >> 7,0);
            auVar145._28_4_ =
                 (uint)bVar9 * ((uint)bVar15 * auVar109._28_4_ | !bVar15 * uVar161) |
                 !bVar9 * auVar145._28_4_;
            bVar84 = (~bVar80 | bVar83) & bVar84;
          }
        }
        auVar294._8_4_ = 0x7fffffff;
        auVar294._0_8_ = 0x7fffffff7fffffff;
        auVar294._12_4_ = 0x7fffffff;
        auVar297 = ZEXT1664(auVar294);
        auVar109 = vmulps_avx512vl(local_aa0,auVar113);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar111);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,auVar117);
        _local_500 = _local_960;
        local_4e0 = vminps_avx(local_760,auVar144);
        auVar263._8_4_ = 0x7fffffff;
        auVar263._0_8_ = 0x7fffffff7fffffff;
        auVar263._12_4_ = 0x7fffffff;
        auVar263._16_4_ = 0x7fffffff;
        auVar263._20_4_ = 0x7fffffff;
        auVar263._24_4_ = 0x7fffffff;
        auVar263._28_4_ = 0x7fffffff;
        auVar109 = vandps_avx(auVar109,auVar263);
        _local_880 = vmaxps_avx(_local_960,auVar145);
        _local_780 = _local_880;
        auVar179._8_4_ = 0x3e99999a;
        auVar179._0_8_ = 0x3e99999a3e99999a;
        auVar179._12_4_ = 0x3e99999a;
        auVar179._16_4_ = 0x3e99999a;
        auVar179._20_4_ = 0x3e99999a;
        auVar179._24_4_ = 0x3e99999a;
        auVar179._28_4_ = 0x3e99999a;
        uVar24 = vcmpps_avx512vl(auVar109,auVar179,1);
        uVar25 = vcmpps_avx512vl(_local_960,local_4e0,2);
        bVar80 = (byte)uVar25 & bVar82;
        uVar26 = vcmpps_avx512vl(_local_880,local_760,2);
        if ((bVar82 & ((byte)uVar26 | (byte)uVar25)) == 0) {
          auVar186 = ZEXT3264(auVar263);
          auVar292 = ZEXT3264(_DAT_02020f20);
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar304 = ZEXT3264(auVar109);
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar302 = ZEXT3264(auVar109);
        }
        else {
          auVar109 = vmulps_avx512vl(local_aa0,auVar110);
          auVar109 = vfmadd213ps_avx512vl(auVar116,auVar107,auVar109);
          auVar109 = vfmadd213ps_avx512vl(auVar238._0_32_,auVar106,auVar109);
          auVar109 = vandps_avx(auVar109,auVar263);
          uVar25 = vcmpps_avx512vl(auVar109,auVar179,1);
          bVar83 = (byte)uVar25 | ~bVar84;
          auVar180._8_4_ = 2;
          auVar180._0_8_ = 0x200000002;
          auVar180._12_4_ = 2;
          auVar180._16_4_ = 2;
          auVar180._20_4_ = 2;
          auVar180._24_4_ = 2;
          auVar180._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar109 = vpblendmd_avx512vl(auVar180,auVar40);
          local_740._0_4_ = (uint)(bVar83 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar83 & 1) * 2;
          bVar9 = (bool)(bVar83 >> 1 & 1);
          local_740._4_4_ = (uint)bVar9 * auVar109._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 2 & 1);
          local_740._8_4_ = (uint)bVar9 * auVar109._8_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 3 & 1);
          local_740._12_4_ = (uint)bVar9 * auVar109._12_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 4 & 1);
          local_740._16_4_ = (uint)bVar9 * auVar109._16_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 5 & 1);
          local_740._20_4_ = (uint)bVar9 * auVar109._20_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar83 >> 6 & 1);
          local_740._24_4_ = (uint)bVar9 * auVar109._24_4_ | (uint)!bVar9 * 2;
          local_740._28_4_ = (uint)(bVar83 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar83 >> 7) * 2;
          auVar149._0_32_ = vpbroadcastd_avx512vl();
          auVar149._32_32_ = auVar108;
          local_7e0 = auVar149._0_32_;
          uVar25 = vpcmpd_avx512vl(auVar149._0_32_,local_740,5);
          bVar83 = (byte)uVar25 & bVar80;
          if (bVar83 != 0) {
            auVar98 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar97 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar288 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar105 = vminps_avx(auVar98,auVar288);
            auVar98 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar288 = vmaxps_avx(auVar97,auVar98);
            auVar97 = vandps_avx(auVar294,auVar105);
            auVar98 = vandps_avx(auVar294,auVar288);
            auVar97 = vmaxps_avx(auVar97,auVar98);
            auVar98 = vmovshdup_avx(auVar97);
            auVar98 = vmaxss_avx(auVar98,auVar97);
            auVar97 = vshufpd_avx(auVar97,auVar97,1);
            auVar97 = vmaxss_avx(auVar97,auVar98);
            fVar259 = auVar97._0_4_ * 1.9073486e-06;
            local_9c0 = vshufps_avx(auVar288,auVar288,0xff);
            local_860 = (float)local_960._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_960._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_958 + fStack_938;
            fStack_854 = fStack_954 + fStack_934;
            fStack_850 = fStack_950 + fStack_930;
            fStack_84c = fStack_94c + fStack_92c;
            fStack_848 = fStack_948 + fStack_928;
            fStack_844 = fStack_944 + fStack_924;
            do {
              auVar181._8_4_ = 0x7f800000;
              auVar181._0_8_ = 0x7f8000007f800000;
              auVar181._12_4_ = 0x7f800000;
              auVar181._16_4_ = 0x7f800000;
              auVar181._20_4_ = 0x7f800000;
              auVar181._24_4_ = 0x7f800000;
              auVar181._28_4_ = 0x7f800000;
              auVar108 = vblendmps_avx512vl(auVar181,_local_960);
              auVar146._0_4_ =
                   (uint)(bVar83 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar83 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 1 & 1);
              auVar146._4_4_ = (uint)bVar9 * auVar108._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 2 & 1);
              auVar146._8_4_ = (uint)bVar9 * auVar108._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 3 & 1);
              auVar146._12_4_ = (uint)bVar9 * auVar108._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 4 & 1);
              auVar146._16_4_ = (uint)bVar9 * auVar108._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar83 >> 5 & 1);
              auVar146._20_4_ = (uint)bVar9 * auVar108._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar146._24_4_ =
                   (uint)(bVar83 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar83 >> 6) * 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar149._0_32_ = auVar146;
              auVar108 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar108 = vminps_avx(auVar146,auVar108);
              auVar109 = vshufpd_avx(auVar108,auVar108,5);
              auVar108 = vminps_avx(auVar108,auVar109);
              auVar109 = vpermpd_avx2(auVar108,0x4e);
              auVar108 = vminps_avx(auVar108,auVar109);
              uVar25 = vcmpps_avx512vl(auVar146,auVar108,0);
              bVar77 = (byte)uVar25 & bVar83;
              bVar78 = bVar83;
              if (bVar77 != 0) {
                bVar78 = bVar77;
              }
              iVar27 = 0;
              for (uVar90 = (uint)bVar78; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar27 = iVar27 + 1;
              }
              uVar90 = *(uint *)(local_820 + (uint)(iVar27 << 2));
              uVar155 = *(uint *)(local_500 + (uint)(iVar27 << 2));
              fVar264 = auVar94._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar264 = sqrtf((float)local_a60._0_4_);
              }
              auVar186 = ZEXT464(uVar90);
              auVar285 = ZEXT464(uVar155);
              lVar87 = 4;
              do {
                auVar108 = auVar149._32_32_;
                fVar265 = auVar285._0_4_;
                auVar168._4_4_ = fVar265;
                auVar168._0_4_ = fVar265;
                auVar168._8_4_ = fVar265;
                auVar168._12_4_ = fVar265;
                auVar97 = vfmadd132ps_fma(auVar168,ZEXT816(0) << 0x40,local_a50);
                fVar255 = auVar186._0_4_;
                fVar163 = 1.0 - fVar255;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar287 = auVar186._0_16_;
                auVar288 = vfmadd213ss_fma(auVar99,auVar287,auVar96);
                auVar98 = vfmadd213ss_fma(auVar288,ZEXT416((uint)(fVar255 * fVar255)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar105 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar163),auVar96);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)(fVar163 * fVar163)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar266 = fVar163 * fVar163 * -fVar255 * 0.5;
                fVar267 = auVar98._0_4_ * 0.5;
                fVar269 = auVar105._0_4_ * 0.5;
                fVar268 = fVar255 * fVar255 * -fVar163 * 0.5;
                auVar228._0_4_ = fVar268 * (float)local_a40._0_4_;
                auVar228._4_4_ = fVar268 * (float)local_a40._4_4_;
                auVar228._8_4_ = fVar268 * fStack_a38;
                auVar228._12_4_ = fVar268 * fStack_a34;
                auVar243._4_4_ = fVar269;
                auVar243._0_4_ = fVar269;
                auVar243._8_4_ = fVar269;
                auVar243._12_4_ = fVar269;
                auVar98 = vfmadd132ps_fma(auVar243,auVar228,local_a00._0_16_);
                auVar212._4_4_ = fVar267;
                auVar212._0_4_ = fVar267;
                auVar212._8_4_ = fVar267;
                auVar212._12_4_ = fVar267;
                auVar98 = vfmadd132ps_fma(auVar212,auVar98,local_a20._0_16_);
                auVar229._4_4_ = fVar266;
                auVar229._0_4_ = fVar266;
                auVar229._8_4_ = fVar266;
                auVar229._12_4_ = fVar266;
                auVar98 = vfmadd132ps_fma(auVar229,auVar98,local_9e0._0_16_);
                auVar105 = vfmadd231ss_fma(auVar96,auVar287,ZEXT416(0x41100000));
                local_900._0_16_ = auVar105;
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar287,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar105;
                local_980 = vfmadd213ss_fma(auVar99,auVar287,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar98;
                auVar98 = vsubps_avx(auVar97,auVar98);
                auVar97 = vdpps_avx(auVar98,auVar98,0x7f);
                fVar266 = auVar97._0_4_;
                if (fVar266 < 0.0) {
                  local_ae0._0_4_ = auVar288._0_4_;
                  local_b00._0_16_ = ZEXT416((uint)fVar163);
                  auVar297._0_4_ = sqrtf(fVar266);
                  auVar297._4_60_ = extraout_var;
                  auVar288 = ZEXT416((uint)local_ae0._0_4_);
                  auVar105 = auVar297._0_16_;
                  auVar96 = local_b00._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar97,auVar97);
                  auVar96 = ZEXT416((uint)fVar163);
                }
                fVar267 = auVar96._0_4_;
                auVar100 = vfnmadd231ss_fma(ZEXT416((uint)(fVar255 * (fVar267 + fVar267))),auVar96,
                                            auVar96);
                auVar288 = vfmadd213ss_fma(auVar288,ZEXT416((uint)(fVar255 + fVar255)),
                                           ZEXT416((uint)(fVar255 * fVar255 * 3.0)));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar287,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267 * -3.0)),
                                          ZEXT416((uint)(fVar267 + fVar267)),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(fVar163 * -2.0)),auVar287,
                                          ZEXT416((uint)(fVar255 * fVar255)));
                fVar267 = auVar100._0_4_ * 0.5;
                fVar269 = auVar288._0_4_ * 0.5;
                fVar268 = auVar99._0_4_ * 0.5;
                fVar163 = auVar96._0_4_ * 0.5;
                auVar230._0_4_ = fVar163 * (float)local_a40._0_4_;
                auVar230._4_4_ = fVar163 * (float)local_a40._4_4_;
                auVar230._8_4_ = fVar163 * fStack_a38;
                auVar230._12_4_ = fVar163 * fStack_a34;
                auVar213._4_4_ = fVar268;
                auVar213._0_4_ = fVar268;
                auVar213._8_4_ = fVar268;
                auVar213._12_4_ = fVar268;
                auVar288 = vfmadd132ps_fma(auVar213,auVar230,local_a00._0_16_);
                auVar190._4_4_ = fVar269;
                auVar190._0_4_ = fVar269;
                auVar190._8_4_ = fVar269;
                auVar190._12_4_ = fVar269;
                auVar288 = vfmadd132ps_fma(auVar190,auVar288,local_a20._0_16_);
                auVar298._4_4_ = fVar267;
                auVar298._0_4_ = fVar267;
                auVar298._8_4_ = fVar267;
                auVar298._12_4_ = fVar267;
                local_ae0._0_16_ = vfmadd132ps_fma(auVar298,auVar288,local_9e0._0_16_);
                auVar288 = vdpps_avx(local_ae0._0_16_,local_ae0._0_16_,0x7f);
                auVar55._12_4_ = 0;
                auVar55._0_12_ = ZEXT812(0);
                fVar267 = auVar288._0_4_;
                auVar96 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar267));
                fVar269 = auVar96._0_4_;
                auVar99 = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar267));
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar100 = vxorps_avx512vl(auVar288,auVar30);
                auVar96 = vfnmadd213ss_fma(auVar99,auVar288,SUB6416(ZEXT464(0x40000000),0));
                local_b00._0_4_ = auVar105._0_4_;
                if (fVar267 < auVar100._0_4_) {
                  auVar224._0_4_ = sqrtf(fVar267);
                  auVar224._4_60_ = extraout_var_00;
                  auVar105 = ZEXT416((uint)local_b00._0_4_);
                  auVar100 = auVar224._0_16_;
                  auVar288 = local_ae0._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx512f(auVar288,auVar288);
                  auVar288 = local_ae0._0_16_;
                }
                fVar269 = fVar269 * 1.5 + fVar267 * -0.5 * fVar269 * fVar269 * fVar269;
                auVar169._0_4_ = auVar288._0_4_ * fVar269;
                auVar169._4_4_ = auVar288._4_4_ * fVar269;
                auVar169._8_4_ = auVar288._8_4_ * fVar269;
                auVar169._12_4_ = auVar288._12_4_ * fVar269;
                auVar23 = vdpps_avx(auVar98,auVar169,0x7f);
                fVar256 = auVar105._0_4_;
                fVar268 = auVar23._0_4_;
                auVar170._0_4_ = fVar268 * fVar268;
                auVar170._4_4_ = auVar23._4_4_ * auVar23._4_4_;
                auVar170._8_4_ = auVar23._8_4_ * auVar23._8_4_;
                auVar170._12_4_ = auVar23._12_4_ * auVar23._12_4_;
                auVar101 = vsubps_avx512vl(auVar97,auVar170);
                fVar163 = auVar101._0_4_;
                auVar191._4_12_ = ZEXT812(0) << 0x20;
                auVar191._0_4_ = fVar163;
                auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar191);
                auVar103 = vmulss_avx512f(auVar102,ZEXT416(0x3fc00000));
                auVar104 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
                if (fVar163 < 0.0) {
                  local_9a0 = fVar269;
                  fStack_99c = fVar269;
                  fStack_998 = fVar269;
                  fStack_994 = fVar269;
                  local_990 = auVar102;
                  fVar163 = sqrtf(fVar163);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar100 = ZEXT416(auVar100._0_4_);
                  auVar105 = ZEXT416((uint)local_b00._0_4_);
                  auVar288 = local_ae0._0_16_;
                  auVar102 = local_990;
                  fVar269 = local_9a0;
                  fVar257 = fStack_99c;
                  fVar258 = fStack_998;
                  fVar270 = fStack_994;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar101,auVar101);
                  fVar163 = auVar101._0_4_;
                  fVar257 = fVar269;
                  fVar258 = fVar269;
                  fVar270 = fVar269;
                }
                auVar295._8_4_ = 0x7fffffff;
                auVar295._0_8_ = 0x7fffffff7fffffff;
                auVar295._12_4_ = 0x7fffffff;
                auVar297 = ZEXT1664(auVar295);
                auVar238._32_32_ = auVar108;
                auVar238._0_32_ = local_aa0;
                auVar303 = ZEXT3264(local_aa0);
                auVar192._0_4_ = (float)local_980._0_4_ * (float)local_a40._0_4_;
                auVar192._4_4_ = (float)local_980._0_4_ * (float)local_a40._4_4_;
                auVar192._8_4_ = (float)local_980._0_4_ * fStack_a38;
                auVar192._12_4_ = (float)local_980._0_4_ * fStack_a34;
                auVar214._4_4_ = local_920._0_4_;
                auVar214._0_4_ = local_920._0_4_;
                auVar214._8_4_ = local_920._0_4_;
                auVar214._12_4_ = local_920._0_4_;
                auVar101 = vfmadd132ps_fma(auVar214,auVar192,local_a00._0_16_);
                auVar193._4_4_ = local_900._0_4_;
                auVar193._0_4_ = local_900._0_4_;
                auVar193._8_4_ = local_900._0_4_;
                auVar193._12_4_ = local_900._0_4_;
                auVar101 = vfmadd132ps_fma(auVar193,auVar101,local_a20._0_16_);
                auVar287 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar287,
                                           ZEXT416(0x40000000));
                auVar215._0_4_ = auVar287._0_4_;
                auVar215._4_4_ = auVar215._0_4_;
                auVar215._8_4_ = auVar215._0_4_;
                auVar215._12_4_ = auVar215._0_4_;
                auVar287 = vfmadd132ps_fma(auVar215,auVar101,local_9e0._0_16_);
                auVar194._0_4_ = auVar287._0_4_ * fVar267;
                auVar194._4_4_ = auVar287._4_4_ * fVar267;
                auVar194._8_4_ = auVar287._8_4_ * fVar267;
                auVar194._12_4_ = auVar287._12_4_ * fVar267;
                auVar287 = vdpps_avx(auVar288,auVar287,0x7f);
                fVar267 = auVar287._0_4_;
                auVar216._0_4_ = auVar288._0_4_ * fVar267;
                auVar216._4_4_ = auVar288._4_4_ * fVar267;
                auVar216._8_4_ = auVar288._8_4_ * fVar267;
                auVar216._12_4_ = auVar288._12_4_ * fVar267;
                auVar287 = vsubps_avx(auVar194,auVar216);
                local_bd0 = auVar99._0_4_;
                local_bd0 = auVar96._0_4_ * local_bd0;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar149._16_48_ = auVar238._16_48_;
                auVar101 = vxorps_avx512vl(auVar288,auVar31);
                auVar244._0_4_ = fVar269 * auVar287._0_4_ * local_bd0;
                auVar244._4_4_ = fVar257 * auVar287._4_4_ * local_bd0;
                auVar244._8_4_ = fVar258 * auVar287._8_4_ * local_bd0;
                auVar244._12_4_ = fVar270 * auVar287._12_4_ * local_bd0;
                auVar96 = vdpps_avx(auVar101,auVar169,0x7f);
                auVar287 = vmaxss_avx(ZEXT416((uint)fVar259),
                                      ZEXT416((uint)(fVar265 * fVar264 * 1.9073486e-06)));
                auVar100 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar100);
                auVar99 = vdpps_avx(auVar98,auVar244,0x7f);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar259),auVar287);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar256 + 1.0)),auVar100,auVar105);
                auVar105 = vdpps_avx(local_a50,auVar169,0x7f);
                fVar267 = auVar96._0_4_ + auVar99._0_4_;
                auVar96 = vdpps_avx(auVar98,auVar101,0x7f);
                auVar101 = vmulss_avx512f(auVar104,auVar102);
                auVar102 = vmulss_avx512f(auVar102,auVar102);
                auVar99 = vdpps_avx(auVar98,local_a50,0x7f);
                auVar149._0_16_ =
                     vaddss_avx512f(auVar103,ZEXT416((uint)(auVar101._0_4_ * auVar102._0_4_)));
                auVar102 = vfnmadd231ss_fma(auVar96,auVar23,ZEXT416((uint)fVar267));
                auVar101 = vfnmadd231ss_fma(auVar99,auVar23,auVar105);
                auVar96 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar163 = fVar163 - auVar96._0_4_;
                auVar96 = vshufps_avx(auVar288,auVar288,0xff);
                auVar99 = vfmsub213ss_fma(auVar102,auVar149._0_16_,auVar96);
                fVar269 = auVar101._0_4_ * auVar149._0_4_;
                auVar102 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar99._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar269));
                fVar256 = auVar102._0_4_;
                fVar255 = fVar255 - (fVar268 * (fVar269 / fVar256) -
                                    fVar163 * (auVar105._0_4_ / fVar256));
                auVar186 = ZEXT464((uint)fVar255);
                fVar265 = fVar265 - (fVar163 * (fVar267 / fVar256) -
                                    fVar268 * (auVar99._0_4_ / fVar256));
                auVar285 = ZEXT464((uint)fVar265);
                auVar105 = vandps_avx(auVar23,auVar295);
                if (auVar100._0_4_ <= auVar105._0_4_) {
LAB_01cb3527:
                  bVar9 = false;
                }
                else {
                  auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar100._0_4_ + auVar287._0_4_)),
                                            local_9c0,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(auVar295,ZEXT416((uint)fVar163));
                  if (auVar99._0_4_ <= auVar105._0_4_) goto LAB_01cb3527;
                  fVar265 = fVar265 + (float)local_9b0._0_4_;
                  auVar285 = ZEXT464((uint)fVar265);
                  bVar9 = true;
                  if ((((fVar162 <= fVar265) &&
                       (fVar267 = *(float *)(ray + k * 4 + 0x200), fVar265 <= fVar267)) &&
                      (0.0 <= fVar255)) && (fVar255 <= 1.0)) {
                    auVar150._16_48_ = auVar149._16_48_;
                    auVar150._0_16_ = ZEXT816(0) << 0x20;
                    auVar302._4_60_ = auVar150._4_60_;
                    auVar302._0_4_ = fVar266;
                    auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar302._0_16_);
                    fVar266 = auVar105._0_4_;
                    auVar149._0_16_ = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar149._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar195._0_4_ = auVar98._0_4_ * fVar266;
                      auVar195._4_4_ = auVar98._4_4_ * fVar266;
                      auVar195._8_4_ = auVar98._8_4_ * fVar266;
                      auVar195._12_4_ = auVar98._12_4_ * fVar266;
                      auVar105 = vfmadd213ps_fma(auVar96,auVar195,auVar288);
                      auVar97 = vshufps_avx(auVar195,auVar195,0xc9);
                      auVar98 = vshufps_avx(auVar288,auVar288,0xc9);
                      auVar196._0_4_ = auVar195._0_4_ * auVar98._0_4_;
                      auVar196._4_4_ = auVar195._4_4_ * auVar98._4_4_;
                      auVar196._8_4_ = auVar195._8_4_ * auVar98._8_4_;
                      auVar196._12_4_ = auVar195._12_4_ * auVar98._12_4_;
                      auVar288 = vfmsub231ps_fma(auVar196,auVar288,auVar97);
                      auVar97 = vshufps_avx(auVar288,auVar288,0xc9);
                      auVar98 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar288 = vshufps_avx(auVar288,auVar288,0xd2);
                      auVar171._0_4_ = auVar105._0_4_ * auVar288._0_4_;
                      auVar171._4_4_ = auVar105._4_4_ * auVar288._4_4_;
                      auVar171._8_4_ = auVar105._8_4_ * auVar288._8_4_;
                      auVar171._12_4_ = auVar105._12_4_ * auVar288._12_4_;
                      auVar97 = vfmsub231ps_fma(auVar171,auVar97,auVar98);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar265;
                        uVar239 = vextractps_avx(auVar97,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar239;
                        uVar239 = vextractps_avx(auVar97,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar239;
                        *(int *)(ray + k * 4 + 0x380) = auVar97._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar255;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(int *)(ray + k * 4 + 0x440) = (int)local_aa8;
                        *(uint *)(ray + k * 4 + 0x480) = uVar81;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar98 = ZEXT416((uint)fVar255);
                        local_340 = vbroadcastss_avx512f(auVar98);
                        auVar292 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar292 = vpermps_avx512f(auVar292,ZEXT1664(auVar97));
                        auVar304 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar304,ZEXT1664(auVar97));
                        local_380 = vbroadcastss_avx512f(auVar97);
                        local_400[0] = (RTCHitN)auVar292[0];
                        local_400[1] = (RTCHitN)auVar292[1];
                        local_400[2] = (RTCHitN)auVar292[2];
                        local_400[3] = (RTCHitN)auVar292[3];
                        local_400[4] = (RTCHitN)auVar292[4];
                        local_400[5] = (RTCHitN)auVar292[5];
                        local_400[6] = (RTCHitN)auVar292[6];
                        local_400[7] = (RTCHitN)auVar292[7];
                        local_400[8] = (RTCHitN)auVar292[8];
                        local_400[9] = (RTCHitN)auVar292[9];
                        local_400[10] = (RTCHitN)auVar292[10];
                        local_400[0xb] = (RTCHitN)auVar292[0xb];
                        local_400[0xc] = (RTCHitN)auVar292[0xc];
                        local_400[0xd] = (RTCHitN)auVar292[0xd];
                        local_400[0xe] = (RTCHitN)auVar292[0xe];
                        local_400[0xf] = (RTCHitN)auVar292[0xf];
                        local_400[0x10] = (RTCHitN)auVar292[0x10];
                        local_400[0x11] = (RTCHitN)auVar292[0x11];
                        local_400[0x12] = (RTCHitN)auVar292[0x12];
                        local_400[0x13] = (RTCHitN)auVar292[0x13];
                        local_400[0x14] = (RTCHitN)auVar292[0x14];
                        local_400[0x15] = (RTCHitN)auVar292[0x15];
                        local_400[0x16] = (RTCHitN)auVar292[0x16];
                        local_400[0x17] = (RTCHitN)auVar292[0x17];
                        local_400[0x18] = (RTCHitN)auVar292[0x18];
                        local_400[0x19] = (RTCHitN)auVar292[0x19];
                        local_400[0x1a] = (RTCHitN)auVar292[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar292[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar292[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar292[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar292[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar292[0x1f];
                        local_400[0x20] = (RTCHitN)auVar292[0x20];
                        local_400[0x21] = (RTCHitN)auVar292[0x21];
                        local_400[0x22] = (RTCHitN)auVar292[0x22];
                        local_400[0x23] = (RTCHitN)auVar292[0x23];
                        local_400[0x24] = (RTCHitN)auVar292[0x24];
                        local_400[0x25] = (RTCHitN)auVar292[0x25];
                        local_400[0x26] = (RTCHitN)auVar292[0x26];
                        local_400[0x27] = (RTCHitN)auVar292[0x27];
                        local_400[0x28] = (RTCHitN)auVar292[0x28];
                        local_400[0x29] = (RTCHitN)auVar292[0x29];
                        local_400[0x2a] = (RTCHitN)auVar292[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar292[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar292[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar292[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar292[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar292[0x2f];
                        local_400[0x30] = (RTCHitN)auVar292[0x30];
                        local_400[0x31] = (RTCHitN)auVar292[0x31];
                        local_400[0x32] = (RTCHitN)auVar292[0x32];
                        local_400[0x33] = (RTCHitN)auVar292[0x33];
                        local_400[0x34] = (RTCHitN)auVar292[0x34];
                        local_400[0x35] = (RTCHitN)auVar292[0x35];
                        local_400[0x36] = (RTCHitN)auVar292[0x36];
                        local_400[0x37] = (RTCHitN)auVar292[0x37];
                        local_400[0x38] = (RTCHitN)auVar292[0x38];
                        local_400[0x39] = (RTCHitN)auVar292[0x39];
                        local_400[0x3a] = (RTCHitN)auVar292[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar292[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar292[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar292[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar292[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar292[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar292 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar292);
                        auVar108 = vpcmpeqd_avx2(auVar292._0_32_,auVar292._0_32_);
                        local_ab8[3] = auVar108;
                        local_ab8[2] = auVar108;
                        local_ab8[1] = auVar108;
                        *local_ab8 = auVar108;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar7->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar7->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar265;
                        local_8c0 = local_4c0;
                        local_b30.valid = (int *)local_8c0;
                        local_b30.geometryUserPtr = pGVar3->userPtr;
                        local_b30.context = context->user;
                        local_b30.hit = local_400;
                        local_b30.N = 0x10;
                        local_b30.ray = (RTCRayN *)ray;
                        if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->intersectionFilterN)(&local_b30);
                          auVar285 = ZEXT1664(ZEXT416((uint)fVar265));
                          auVar186 = ZEXT1664(auVar98);
                          auVar303 = ZEXT3264(local_aa0);
                          auVar297 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar149 = vmovdqa64_avx512f(local_8c0);
                        uVar25 = vptestmd_avx512f(auVar149,auVar149);
                        if ((short)uVar25 != 0) {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var8)(&local_b30);
                            auVar285 = ZEXT1664(ZEXT416((uint)fVar265));
                            auVar186 = ZEXT1664(auVar98);
                            auVar303 = ZEXT3264(local_aa0);
                            auVar297 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar149 = vmovdqa64_avx512f(local_8c0);
                          uVar89 = vptestmd_avx512f(auVar149,auVar149);
                          if ((short)uVar89 != 0) {
                            iVar57 = *(int *)(local_b30.hit + 4);
                            iVar58 = *(int *)(local_b30.hit + 8);
                            iVar59 = *(int *)(local_b30.hit + 0xc);
                            iVar60 = *(int *)(local_b30.hit + 0x10);
                            iVar61 = *(int *)(local_b30.hit + 0x14);
                            iVar62 = *(int *)(local_b30.hit + 0x18);
                            iVar63 = *(int *)(local_b30.hit + 0x1c);
                            iVar64 = *(int *)(local_b30.hit + 0x20);
                            iVar65 = *(int *)(local_b30.hit + 0x24);
                            iVar66 = *(int *)(local_b30.hit + 0x28);
                            iVar67 = *(int *)(local_b30.hit + 0x2c);
                            iVar68 = *(int *)(local_b30.hit + 0x30);
                            iVar69 = *(int *)(local_b30.hit + 0x34);
                            iVar70 = *(int *)(local_b30.hit + 0x38);
                            iVar71 = *(int *)(local_b30.hit + 0x3c);
                            bVar78 = (byte)uVar89;
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar77 = (byte)(uVar89 >> 8);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x300) =
                                 (uint)(bVar78 & 1) * *(int *)local_b30.hit |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x300);
                            *(uint *)(local_b30.ray + 0x304) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x304);
                            *(uint *)(local_b30.ray + 0x308) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x308);
                            *(uint *)(local_b30.ray + 0x30c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x30c);
                            *(uint *)(local_b30.ray + 0x310) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x310);
                            *(uint *)(local_b30.ray + 0x314) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x314);
                            *(uint *)(local_b30.ray + 0x318) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x318);
                            *(uint *)(local_b30.ray + 0x31c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x31c);
                            *(uint *)(local_b30.ray + 800) =
                                 (uint)(bVar77 & 1) * iVar64 |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 800);
                            *(uint *)(local_b30.ray + 0x324) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x324);
                            *(uint *)(local_b30.ray + 0x328) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x328);
                            *(uint *)(local_b30.ray + 0x32c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x32c);
                            *(uint *)(local_b30.ray + 0x330) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x330);
                            *(uint *)(local_b30.ray + 0x334) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x334);
                            *(uint *)(local_b30.ray + 0x338) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x338);
                            *(uint *)(local_b30.ray + 0x33c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x33c);
                            iVar57 = *(int *)(local_b30.hit + 0x44);
                            iVar58 = *(int *)(local_b30.hit + 0x48);
                            iVar59 = *(int *)(local_b30.hit + 0x4c);
                            iVar60 = *(int *)(local_b30.hit + 0x50);
                            iVar61 = *(int *)(local_b30.hit + 0x54);
                            iVar62 = *(int *)(local_b30.hit + 0x58);
                            iVar63 = *(int *)(local_b30.hit + 0x5c);
                            iVar64 = *(int *)(local_b30.hit + 0x60);
                            iVar65 = *(int *)(local_b30.hit + 100);
                            iVar66 = *(int *)(local_b30.hit + 0x68);
                            iVar67 = *(int *)(local_b30.hit + 0x6c);
                            iVar68 = *(int *)(local_b30.hit + 0x70);
                            iVar69 = *(int *)(local_b30.hit + 0x74);
                            iVar70 = *(int *)(local_b30.hit + 0x78);
                            iVar71 = *(int *)(local_b30.hit + 0x7c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x340) =
                                 (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x40) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x340);
                            *(uint *)(local_b30.ray + 0x344) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x344);
                            *(uint *)(local_b30.ray + 0x348) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x348);
                            *(uint *)(local_b30.ray + 0x34c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x34c);
                            *(uint *)(local_b30.ray + 0x350) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x350);
                            *(uint *)(local_b30.ray + 0x354) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x354);
                            *(uint *)(local_b30.ray + 0x358) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x358);
                            *(uint *)(local_b30.ray + 0x35c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x35c);
                            *(uint *)(local_b30.ray + 0x360) =
                                 (uint)(bVar77 & 1) * iVar64 |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x360);
                            *(uint *)(local_b30.ray + 0x364) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x364);
                            *(uint *)(local_b30.ray + 0x368) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x368);
                            *(uint *)(local_b30.ray + 0x36c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x36c);
                            *(uint *)(local_b30.ray + 0x370) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x370);
                            *(uint *)(local_b30.ray + 0x374) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x374);
                            *(uint *)(local_b30.ray + 0x378) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x378);
                            *(uint *)(local_b30.ray + 0x37c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x37c);
                            iVar57 = *(int *)(local_b30.hit + 0x84);
                            iVar58 = *(int *)(local_b30.hit + 0x88);
                            iVar59 = *(int *)(local_b30.hit + 0x8c);
                            iVar60 = *(int *)(local_b30.hit + 0x90);
                            iVar61 = *(int *)(local_b30.hit + 0x94);
                            iVar62 = *(int *)(local_b30.hit + 0x98);
                            iVar63 = *(int *)(local_b30.hit + 0x9c);
                            iVar64 = *(int *)(local_b30.hit + 0xa0);
                            iVar65 = *(int *)(local_b30.hit + 0xa4);
                            iVar66 = *(int *)(local_b30.hit + 0xa8);
                            iVar67 = *(int *)(local_b30.hit + 0xac);
                            iVar68 = *(int *)(local_b30.hit + 0xb0);
                            iVar69 = *(int *)(local_b30.hit + 0xb4);
                            iVar70 = *(int *)(local_b30.hit + 0xb8);
                            iVar71 = *(int *)(local_b30.hit + 0xbc);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x380) =
                                 (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x80) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x380);
                            *(uint *)(local_b30.ray + 900) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 900);
                            *(uint *)(local_b30.ray + 0x388) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x388);
                            *(uint *)(local_b30.ray + 0x38c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x38c);
                            *(uint *)(local_b30.ray + 0x390) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x390);
                            *(uint *)(local_b30.ray + 0x394) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x394);
                            *(uint *)(local_b30.ray + 0x398) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x398);
                            *(uint *)(local_b30.ray + 0x39c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x39c);
                            *(uint *)(local_b30.ray + 0x3a0) =
                                 (uint)(bVar77 & 1) * iVar64 |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x3a0);
                            *(uint *)(local_b30.ray + 0x3a4) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x3a4);
                            *(uint *)(local_b30.ray + 0x3a8) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a8);
                            *(uint *)(local_b30.ray + 0x3ac) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ac);
                            *(uint *)(local_b30.ray + 0x3b0) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x3b0);
                            *(uint *)(local_b30.ray + 0x3b4) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b4);
                            *(uint *)(local_b30.ray + 0x3b8) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b8);
                            *(uint *)(local_b30.ray + 0x3bc) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x3bc);
                            iVar57 = *(int *)(local_b30.hit + 0xc4);
                            iVar58 = *(int *)(local_b30.hit + 200);
                            iVar59 = *(int *)(local_b30.hit + 0xcc);
                            iVar60 = *(int *)(local_b30.hit + 0xd0);
                            iVar61 = *(int *)(local_b30.hit + 0xd4);
                            iVar62 = *(int *)(local_b30.hit + 0xd8);
                            iVar63 = *(int *)(local_b30.hit + 0xdc);
                            iVar64 = *(int *)(local_b30.hit + 0xe0);
                            iVar65 = *(int *)(local_b30.hit + 0xe4);
                            iVar66 = *(int *)(local_b30.hit + 0xe8);
                            iVar67 = *(int *)(local_b30.hit + 0xec);
                            iVar68 = *(int *)(local_b30.hit + 0xf0);
                            iVar69 = *(int *)(local_b30.hit + 0xf4);
                            iVar70 = *(int *)(local_b30.hit + 0xf8);
                            iVar71 = *(int *)(local_b30.hit + 0xfc);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x3c0) =
                                 (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0xc0) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x3c0);
                            *(uint *)(local_b30.ray + 0x3c4) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x3c4);
                            *(uint *)(local_b30.ray + 0x3c8) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c8);
                            *(uint *)(local_b30.ray + 0x3cc) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x3cc);
                            *(uint *)(local_b30.ray + 0x3d0) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x3d0);
                            *(uint *)(local_b30.ray + 0x3d4) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d4);
                            *(uint *)(local_b30.ray + 0x3d8) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d8);
                            *(uint *)(local_b30.ray + 0x3dc) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x3dc);
                            *(uint *)(local_b30.ray + 0x3e0) =
                                 (uint)(bVar77 & 1) * iVar64 |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x3e0);
                            *(uint *)(local_b30.ray + 0x3e4) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x3e4);
                            *(uint *)(local_b30.ray + 1000) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 1000);
                            *(uint *)(local_b30.ray + 0x3ec) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ec);
                            *(uint *)(local_b30.ray + 0x3f0) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x3f0);
                            *(uint *)(local_b30.ray + 0x3f4) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f4);
                            *(uint *)(local_b30.ray + 0x3f8) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f8);
                            *(uint *)(local_b30.ray + 0x3fc) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x3fc);
                            iVar57 = *(int *)(local_b30.hit + 0x104);
                            iVar58 = *(int *)(local_b30.hit + 0x108);
                            iVar59 = *(int *)(local_b30.hit + 0x10c);
                            iVar60 = *(int *)(local_b30.hit + 0x110);
                            iVar61 = *(int *)(local_b30.hit + 0x114);
                            iVar62 = *(int *)(local_b30.hit + 0x118);
                            iVar63 = *(int *)(local_b30.hit + 0x11c);
                            iVar64 = *(int *)(local_b30.hit + 0x120);
                            iVar65 = *(int *)(local_b30.hit + 0x124);
                            iVar66 = *(int *)(local_b30.hit + 0x128);
                            iVar67 = *(int *)(local_b30.hit + 300);
                            iVar68 = *(int *)(local_b30.hit + 0x130);
                            iVar69 = *(int *)(local_b30.hit + 0x134);
                            iVar70 = *(int *)(local_b30.hit + 0x138);
                            iVar71 = *(int *)(local_b30.hit + 0x13c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x400) =
                                 (uint)(bVar78 & 1) * *(int *)(local_b30.hit + 0x100) |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x400);
                            *(uint *)(local_b30.ray + 0x404) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x404);
                            *(uint *)(local_b30.ray + 0x408) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x408);
                            *(uint *)(local_b30.ray + 0x40c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x40c);
                            *(uint *)(local_b30.ray + 0x410) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x410);
                            *(uint *)(local_b30.ray + 0x414) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x414);
                            *(uint *)(local_b30.ray + 0x418) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x418);
                            *(uint *)(local_b30.ray + 0x41c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x41c);
                            *(uint *)(local_b30.ray + 0x420) =
                                 (uint)(bVar77 & 1) * iVar64 |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_b30.ray + 0x420);
                            *(uint *)(local_b30.ray + 0x424) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x424);
                            *(uint *)(local_b30.ray + 0x428) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x428);
                            *(uint *)(local_b30.ray + 0x42c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x42c);
                            *(uint *)(local_b30.ray + 0x430) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x430);
                            *(uint *)(local_b30.ray + 0x434) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x434);
                            *(uint *)(local_b30.ray + 0x438) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x438);
                            *(uint *)(local_b30.ray + 0x43c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x43c);
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x140));
                            auVar292 = vmovdqu32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar292;
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x180));
                            auVar292 = vmovdqu32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar292;
                            auVar304 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x1c0));
                            auVar292 = vmovdqa32_avx512f(auVar304);
                            *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar292;
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x200));
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            auVar52._4_56_ = auVar292._8_56_;
                            auVar52._0_4_ =
                                 (uint)bVar88 * auVar292._4_4_ | (uint)!bVar88 * auVar304._4_4_;
                            auVar149._0_8_ = auVar52._0_8_ << 0x20;
                            bVar88 = (bool)((byte)(uVar89 >> 2) & 1);
                            auVar149._8_4_ =
                                 (uint)bVar88 * auVar292._8_4_ | (uint)!bVar88 * auVar304._8_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 3) & 1);
                            auVar149._12_4_ =
                                 (uint)bVar88 * auVar292._12_4_ | (uint)!bVar88 * auVar304._12_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 4) & 1);
                            auVar149._16_4_ =
                                 (uint)bVar88 * auVar292._16_4_ | (uint)!bVar88 * auVar304._16_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 5) & 1);
                            auVar149._20_4_ =
                                 (uint)bVar88 * auVar292._20_4_ | (uint)!bVar88 * auVar304._20_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 6) & 1);
                            auVar149._24_4_ =
                                 (uint)bVar88 * auVar292._24_4_ | (uint)!bVar88 * auVar304._24_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 7) & 1);
                            auVar149._28_4_ =
                                 (uint)bVar88 * auVar292._28_4_ | (uint)!bVar88 * auVar304._28_4_;
                            auVar149._32_4_ =
                                 (uint)(bVar77 & 1) * auVar292._32_4_ |
                                 (uint)!(bool)(bVar77 & 1) * auVar304._32_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 9) & 1);
                            auVar149._36_4_ =
                                 (uint)bVar88 * auVar292._36_4_ | (uint)!bVar88 * auVar304._36_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 10) & 1);
                            auVar149._40_4_ =
                                 (uint)bVar88 * auVar292._40_4_ | (uint)!bVar88 * auVar304._40_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            auVar149._44_4_ =
                                 (uint)bVar88 * auVar292._44_4_ | (uint)!bVar88 * auVar304._44_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            auVar149._48_4_ =
                                 (uint)bVar88 * auVar292._48_4_ | (uint)!bVar88 * auVar304._48_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            auVar149._52_4_ =
                                 (uint)bVar88 * auVar292._52_4_ | (uint)!bVar88 * auVar304._52_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            auVar149._56_4_ =
                                 (uint)bVar88 * auVar292._56_4_ | (uint)!bVar88 * auVar304._56_4_;
                            bVar88 = SUB81(uVar89 >> 0xf,0);
                            auVar149._60_4_ =
                                 (uint)bVar88 * auVar292._60_4_ | (uint)!bVar88 * auVar304._60_4_;
                            auVar292 = vmovdqa32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar292;
                            goto LAB_01cb352a;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar267;
                      }
                    }
                  }
                }
LAB_01cb352a:
                auVar108 = auVar149._32_32_;
                bVar88 = lVar87 != 0;
                lVar87 = lVar87 + -1;
              } while ((!bVar9) && (bVar88));
              auVar72._4_4_ = fStack_85c;
              auVar72._0_4_ = local_860;
              auVar72._8_4_ = fStack_858;
              auVar72._12_4_ = fStack_854;
              auVar72._16_4_ = fStack_850;
              auVar72._20_4_ = fStack_84c;
              auVar72._24_4_ = fStack_848;
              auVar72._28_4_ = fStack_844;
              uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar41._4_4_ = uVar239;
              auVar41._0_4_ = uVar239;
              auVar41._8_4_ = uVar239;
              auVar41._12_4_ = uVar239;
              auVar41._16_4_ = uVar239;
              auVar41._20_4_ = uVar239;
              auVar41._24_4_ = uVar239;
              auVar41._28_4_ = uVar239;
              uVar25 = vcmpps_avx512vl(auVar72,auVar41,2);
              bVar83 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar83 & (byte)uVar25;
            } while (bVar83 != 0);
          }
          auVar182._0_4_ = (float)local_880._0_4_ + (float)local_940._0_4_;
          auVar182._4_4_ = (float)local_880._4_4_ + (float)local_940._4_4_;
          auVar182._8_4_ = fStack_878 + fStack_938;
          auVar182._12_4_ = fStack_874 + fStack_934;
          auVar182._16_4_ = fStack_870 + fStack_930;
          auVar182._20_4_ = fStack_86c + fStack_92c;
          auVar182._24_4_ = fStack_868 + fStack_928;
          auVar182._28_4_ = fStack_864 + fStack_924;
          uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar42._4_4_ = uVar239;
          auVar42._0_4_ = uVar239;
          auVar42._8_4_ = uVar239;
          auVar42._12_4_ = uVar239;
          auVar42._16_4_ = uVar239;
          auVar42._20_4_ = uVar239;
          auVar42._24_4_ = uVar239;
          auVar42._28_4_ = uVar239;
          uVar25 = vcmpps_avx512vl(auVar182,auVar42,2);
          bVar84 = (byte)uVar24 | ~bVar84;
          bVar82 = (byte)uVar26 & bVar82 & (byte)uVar25;
          auVar183._8_4_ = 2;
          auVar183._0_8_ = 0x200000002;
          auVar183._12_4_ = 2;
          auVar183._16_4_ = 2;
          auVar183._20_4_ = 2;
          auVar183._24_4_ = 2;
          auVar183._28_4_ = 2;
          auVar43._8_4_ = 3;
          auVar43._0_8_ = 0x300000003;
          auVar43._12_4_ = 3;
          auVar43._16_4_ = 3;
          auVar43._20_4_ = 3;
          auVar43._24_4_ = 3;
          auVar43._28_4_ = 3;
          auVar109 = vpblendmd_avx512vl(auVar183,auVar43);
          local_880._0_4_ = (uint)(bVar84 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
          bVar9 = (bool)(bVar84 >> 1 & 1);
          local_880._4_4_ = (uint)bVar9 * auVar109._4_4_ | (uint)!bVar9 * 2;
          bVar9 = (bool)(bVar84 >> 2 & 1);
          fStack_878 = (float)((uint)bVar9 * auVar109._8_4_ | (uint)!bVar9 * 2);
          bVar9 = (bool)(bVar84 >> 3 & 1);
          fStack_874 = (float)((uint)bVar9 * auVar109._12_4_ | (uint)!bVar9 * 2);
          bVar9 = (bool)(bVar84 >> 4 & 1);
          fStack_870 = (float)((uint)bVar9 * auVar109._16_4_ | (uint)!bVar9 * 2);
          bVar9 = (bool)(bVar84 >> 5 & 1);
          fStack_86c = (float)((uint)bVar9 * auVar109._20_4_ | (uint)!bVar9 * 2);
          bVar9 = (bool)(bVar84 >> 6 & 1);
          fStack_868 = (float)((uint)bVar9 * auVar109._24_4_ | (uint)!bVar9 * 2);
          fStack_864 = (float)((uint)(bVar84 >> 7) * auVar109._28_4_ |
                              (uint)!(bool)(bVar84 >> 7) * 2);
          auVar154._32_32_ = auVar108;
          auVar154._0_32_ = _local_880;
          uVar24 = vpcmpd_avx512vl(_local_880,local_7e0,2);
          bVar84 = (byte)uVar24 & bVar82;
          if (bVar84 != 0) {
            auVar98 = vminps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar97 = vmaxps_avx(local_9e0._0_16_,local_a20._0_16_);
            auVar288 = vminps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar105 = vminps_avx(auVar98,auVar288);
            auVar98 = vmaxps_avx(local_a00._0_16_,local_a40._0_16_);
            auVar288 = vmaxps_avx(auVar97,auVar98);
            auVar97 = vandps_avx(auVar297._0_16_,auVar105);
            auVar98 = vandps_avx(auVar297._0_16_,auVar288);
            auVar97 = vmaxps_avx(auVar97,auVar98);
            auVar98 = vmovshdup_avx(auVar97);
            auVar98 = vmaxss_avx(auVar98,auVar97);
            auVar97 = vshufpd_avx(auVar97,auVar97,1);
            auVar97 = vmaxss_avx(auVar97,auVar98);
            fVar259 = auVar97._0_4_ * 1.9073486e-06;
            local_9c0 = vshufps_avx(auVar288,auVar288,0xff);
            _local_960 = _local_780;
            local_860 = (float)local_780._0_4_ + (float)local_940._0_4_;
            fStack_85c = (float)local_780._4_4_ + (float)local_940._4_4_;
            fStack_858 = fStack_778 + fStack_938;
            fStack_854 = fStack_774 + fStack_934;
            fStack_850 = fStack_770 + fStack_930;
            fStack_84c = fStack_76c + fStack_92c;
            fStack_848 = fStack_768 + fStack_928;
            fStack_844 = fStack_764 + fStack_924;
            do {
              auVar184._8_4_ = 0x7f800000;
              auVar184._0_8_ = 0x7f8000007f800000;
              auVar184._12_4_ = 0x7f800000;
              auVar184._16_4_ = 0x7f800000;
              auVar184._20_4_ = 0x7f800000;
              auVar184._24_4_ = 0x7f800000;
              auVar184._28_4_ = 0x7f800000;
              auVar108 = vblendmps_avx512vl(auVar184,_local_960);
              auVar147._0_4_ =
                   (uint)(bVar84 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
              bVar9 = (bool)(bVar84 >> 1 & 1);
              auVar147._4_4_ = (uint)bVar9 * auVar108._4_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar84 >> 2 & 1);
              auVar147._8_4_ = (uint)bVar9 * auVar108._8_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar84 >> 3 & 1);
              auVar147._12_4_ = (uint)bVar9 * auVar108._12_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar84 >> 4 & 1);
              auVar147._16_4_ = (uint)bVar9 * auVar108._16_4_ | (uint)!bVar9 * 0x7f800000;
              bVar9 = (bool)(bVar84 >> 5 & 1);
              auVar147._20_4_ = (uint)bVar9 * auVar108._20_4_ | (uint)!bVar9 * 0x7f800000;
              auVar147._24_4_ =
                   (uint)(bVar84 >> 6) * auVar108._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
              auVar147._28_4_ = 0x7f800000;
              auVar154._0_32_ = auVar147;
              auVar108 = vshufps_avx(auVar147,auVar147,0xb1);
              auVar108 = vminps_avx(auVar147,auVar108);
              auVar109 = vshufpd_avx(auVar108,auVar108,5);
              auVar108 = vminps_avx(auVar108,auVar109);
              auVar109 = vpermpd_avx2(auVar108,0x4e);
              auVar108 = vminps_avx(auVar108,auVar109);
              uVar24 = vcmpps_avx512vl(auVar147,auVar108,0);
              bVar78 = (byte)uVar24 & bVar84;
              bVar83 = bVar84;
              if (bVar78 != 0) {
                bVar83 = bVar78;
              }
              iVar27 = 0;
              for (uVar90 = (uint)bVar83; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar27 = iVar27 + 1;
              }
              uVar90 = *(uint *)(local_840 + (uint)(iVar27 << 2));
              fVar264 = *(float *)(local_760 + (uint)(iVar27 << 2));
              fVar265 = auVar95._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar265 = sqrtf((float)local_a60._0_4_);
              }
              auVar186 = ZEXT464(uVar90);
              lVar87 = 4;
              do {
                auVar108 = auVar154._32_32_;
                auVar172._4_4_ = fVar264;
                auVar172._0_4_ = fVar264;
                auVar172._8_4_ = fVar264;
                auVar172._12_4_ = fVar264;
                auVar97 = vfmadd132ps_fma(auVar172,ZEXT816(0) << 0x40,local_a50);
                fVar255 = auVar186._0_4_;
                fVar163 = 1.0 - fVar255;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar96 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar287 = auVar186._0_16_;
                auVar288 = vfmadd213ss_fma(auVar99,auVar287,auVar96);
                auVar98 = vfmadd213ss_fma(auVar288,ZEXT416((uint)(fVar255 * fVar255)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar105 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar163),auVar96);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)(fVar163 * fVar163)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar266 = fVar163 * fVar163 * -fVar255 * 0.5;
                fVar267 = auVar98._0_4_ * 0.5;
                fVar269 = auVar105._0_4_ * 0.5;
                fVar268 = fVar255 * fVar255 * -fVar163 * 0.5;
                auVar231._0_4_ = fVar268 * (float)local_a40._0_4_;
                auVar231._4_4_ = fVar268 * (float)local_a40._4_4_;
                auVar231._8_4_ = fVar268 * fStack_a38;
                auVar231._12_4_ = fVar268 * fStack_a34;
                auVar245._4_4_ = fVar269;
                auVar245._0_4_ = fVar269;
                auVar245._8_4_ = fVar269;
                auVar245._12_4_ = fVar269;
                auVar98 = vfmadd132ps_fma(auVar245,auVar231,local_a00._0_16_);
                auVar217._4_4_ = fVar267;
                auVar217._0_4_ = fVar267;
                auVar217._8_4_ = fVar267;
                auVar217._12_4_ = fVar267;
                auVar98 = vfmadd132ps_fma(auVar217,auVar98,local_a20._0_16_);
                auVar232._4_4_ = fVar266;
                auVar232._0_4_ = fVar266;
                auVar232._8_4_ = fVar266;
                auVar232._12_4_ = fVar266;
                auVar98 = vfmadd132ps_fma(auVar232,auVar98,local_9e0._0_16_);
                auVar105 = vfmadd231ss_fma(auVar96,auVar287,ZEXT416(0x41100000));
                local_900._0_16_ = auVar105;
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar287,
                                           ZEXT416(0x40800000));
                local_920._0_16_ = auVar105;
                local_980 = vfmadd213ss_fma(auVar99,auVar287,ZEXT416(0xbf800000));
                local_8e0._0_16_ = auVar98;
                auVar98 = vsubps_avx(auVar97,auVar98);
                auVar97 = vdpps_avx(auVar98,auVar98,0x7f);
                fVar266 = auVar97._0_4_;
                if (fVar266 < 0.0) {
                  local_ae0._0_4_ = auVar288._0_4_;
                  local_b00._0_16_ = ZEXT416((uint)fVar163);
                  auVar285._0_4_ = sqrtf(fVar266);
                  auVar285._4_60_ = extraout_var_01;
                  auVar288 = ZEXT416((uint)local_ae0._0_4_);
                  auVar105 = auVar285._0_16_;
                  auVar96 = local_b00._0_16_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar97,auVar97);
                  auVar96 = ZEXT416((uint)fVar163);
                }
                fVar267 = auVar96._0_4_;
                auVar100 = vfnmadd231ss_fma(ZEXT416((uint)(fVar255 * (fVar267 + fVar267))),auVar96,
                                            auVar96);
                auVar288 = vfmadd213ss_fma(auVar288,ZEXT416((uint)(fVar255 + fVar255)),
                                           ZEXT416((uint)(fVar255 * fVar255 * 3.0)));
                auVar96 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar287,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267 * -3.0)),
                                          ZEXT416((uint)(fVar267 + fVar267)),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(fVar163 * -2.0)),auVar287,
                                          ZEXT416((uint)(fVar255 * fVar255)));
                fVar267 = auVar100._0_4_ * 0.5;
                fVar269 = auVar288._0_4_ * 0.5;
                fVar268 = auVar99._0_4_ * 0.5;
                fVar163 = auVar96._0_4_ * 0.5;
                auVar233._0_4_ = fVar163 * (float)local_a40._0_4_;
                auVar233._4_4_ = fVar163 * (float)local_a40._4_4_;
                auVar233._8_4_ = fVar163 * fStack_a38;
                auVar233._12_4_ = fVar163 * fStack_a34;
                auVar218._4_4_ = fVar268;
                auVar218._0_4_ = fVar268;
                auVar218._8_4_ = fVar268;
                auVar218._12_4_ = fVar268;
                auVar288 = vfmadd132ps_fma(auVar218,auVar233,local_a00._0_16_);
                auVar197._4_4_ = fVar269;
                auVar197._0_4_ = fVar269;
                auVar197._8_4_ = fVar269;
                auVar197._12_4_ = fVar269;
                auVar288 = vfmadd132ps_fma(auVar197,auVar288,local_a20._0_16_);
                auVar299._4_4_ = fVar267;
                auVar299._0_4_ = fVar267;
                auVar299._8_4_ = fVar267;
                auVar299._12_4_ = fVar267;
                local_ae0._0_16_ = vfmadd132ps_fma(auVar299,auVar288,local_9e0._0_16_);
                auVar288 = vdpps_avx(local_ae0._0_16_,local_ae0._0_16_,0x7f);
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                fVar267 = auVar288._0_4_;
                auVar96 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar267));
                fVar269 = auVar96._0_4_;
                auVar99 = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar267));
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar100 = vxorps_avx512vl(auVar288,auVar32);
                auVar96 = vfnmadd213ss_fma(auVar99,auVar288,SUB6416(ZEXT464(0x40000000),0));
                local_b00._0_4_ = auVar105._0_4_;
                if (fVar267 < auVar100._0_4_) {
                  auVar303._0_4_ = sqrtf(fVar267);
                  auVar303._4_60_ = extraout_var_02;
                  auVar105 = ZEXT416((uint)local_b00._0_4_);
                  auVar100 = auVar303._0_16_;
                  auVar288 = local_ae0._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx512f(auVar288,auVar288);
                  auVar288 = local_ae0._0_16_;
                }
                fVar269 = fVar269 * 1.5 + fVar267 * -0.5 * fVar269 * fVar269 * fVar269;
                auVar173._0_4_ = auVar288._0_4_ * fVar269;
                auVar173._4_4_ = auVar288._4_4_ * fVar269;
                auVar173._8_4_ = auVar288._8_4_ * fVar269;
                auVar173._12_4_ = auVar288._12_4_ * fVar269;
                auVar23 = vdpps_avx(auVar98,auVar173,0x7f);
                fVar256 = auVar105._0_4_;
                fVar268 = auVar23._0_4_;
                auVar174._0_4_ = fVar268 * fVar268;
                auVar174._4_4_ = auVar23._4_4_ * auVar23._4_4_;
                auVar174._8_4_ = auVar23._8_4_ * auVar23._8_4_;
                auVar174._12_4_ = auVar23._12_4_ * auVar23._12_4_;
                auVar101 = vsubps_avx512vl(auVar97,auVar174);
                fVar163 = auVar101._0_4_;
                auVar198._4_12_ = ZEXT812(0) << 0x20;
                auVar198._0_4_ = fVar163;
                auVar102 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar198);
                auVar103 = vmulss_avx512f(auVar102,ZEXT416(0x3fc00000));
                auVar104 = vmulss_avx512f(auVar101,ZEXT416(0xbf000000));
                if (fVar163 < 0.0) {
                  local_9a0 = fVar269;
                  fStack_99c = fVar269;
                  fStack_998 = fVar269;
                  fStack_994 = fVar269;
                  local_990 = auVar102;
                  fVar163 = sqrtf(fVar163);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar103 = ZEXT416(auVar103._0_4_);
                  auVar100 = ZEXT416(auVar100._0_4_);
                  auVar105 = ZEXT416((uint)local_b00._0_4_);
                  auVar288 = local_ae0._0_16_;
                  auVar102 = local_990;
                  fVar269 = local_9a0;
                  fVar257 = fStack_99c;
                  fVar258 = fStack_998;
                  fVar270 = fStack_994;
                }
                else {
                  auVar101 = vsqrtss_avx(auVar101,auVar101);
                  fVar163 = auVar101._0_4_;
                  fVar257 = fVar269;
                  fVar258 = fVar269;
                  fVar270 = fVar269;
                }
                auVar297 = ZEXT1664(auVar98);
                auVar284._8_4_ = 0x7fffffff;
                auVar284._0_8_ = 0x7fffffff7fffffff;
                auVar284._12_4_ = 0x7fffffff;
                auVar285 = ZEXT1664(auVar284);
                auVar151._32_32_ = auVar108;
                auVar151._0_32_ = local_aa0;
                auVar303 = ZEXT3264(local_aa0);
                auVar199._0_4_ = (float)local_980._0_4_ * (float)local_a40._0_4_;
                auVar199._4_4_ = (float)local_980._0_4_ * (float)local_a40._4_4_;
                auVar199._8_4_ = (float)local_980._0_4_ * fStack_a38;
                auVar199._12_4_ = (float)local_980._0_4_ * fStack_a34;
                auVar219._4_4_ = local_920._0_4_;
                auVar219._0_4_ = local_920._0_4_;
                auVar219._8_4_ = local_920._0_4_;
                auVar219._12_4_ = local_920._0_4_;
                auVar101 = vfmadd132ps_fma(auVar219,auVar199,local_a00._0_16_);
                auVar200._4_4_ = local_900._0_4_;
                auVar200._0_4_ = local_900._0_4_;
                auVar200._8_4_ = local_900._0_4_;
                auVar200._12_4_ = local_900._0_4_;
                auVar101 = vfmadd132ps_fma(auVar200,auVar101,local_a20._0_16_);
                auVar287 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar287,
                                           ZEXT416(0x40000000));
                auVar220._0_4_ = auVar287._0_4_;
                auVar220._4_4_ = auVar220._0_4_;
                auVar220._8_4_ = auVar220._0_4_;
                auVar220._12_4_ = auVar220._0_4_;
                auVar287 = vfmadd132ps_fma(auVar220,auVar101,local_9e0._0_16_);
                auVar201._0_4_ = auVar287._0_4_ * fVar267;
                auVar201._4_4_ = auVar287._4_4_ * fVar267;
                auVar201._8_4_ = auVar287._8_4_ * fVar267;
                auVar201._12_4_ = auVar287._12_4_ * fVar267;
                auVar287 = vdpps_avx(auVar288,auVar287,0x7f);
                fVar267 = auVar287._0_4_;
                auVar221._0_4_ = auVar288._0_4_ * fVar267;
                auVar221._4_4_ = auVar288._4_4_ * fVar267;
                auVar221._8_4_ = auVar288._8_4_ * fVar267;
                auVar221._12_4_ = auVar288._12_4_ * fVar267;
                auVar287 = vsubps_avx(auVar201,auVar221);
                local_bd0 = auVar99._0_4_;
                local_bd0 = auVar96._0_4_ * local_bd0;
                auVar33._8_4_ = 0x80000000;
                auVar33._0_8_ = 0x8000000080000000;
                auVar33._12_4_ = 0x80000000;
                auVar154._16_48_ = auVar151._16_48_;
                auVar101 = vxorps_avx512vl(auVar288,auVar33);
                auVar246._0_4_ = fVar269 * auVar287._0_4_ * local_bd0;
                auVar246._4_4_ = fVar257 * auVar287._4_4_ * local_bd0;
                auVar246._8_4_ = fVar258 * auVar287._8_4_ * local_bd0;
                auVar246._12_4_ = fVar270 * auVar287._12_4_ * local_bd0;
                auVar96 = vdpps_avx(auVar101,auVar173,0x7f);
                auVar287 = vmaxss_avx(ZEXT416((uint)fVar259),
                                      ZEXT416((uint)(fVar264 * fVar265 * 1.9073486e-06)));
                auVar100 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar100);
                auVar99 = vdpps_avx(auVar98,auVar246,0x7f);
                auVar105 = vfmadd213ss_fma(auVar105,ZEXT416((uint)fVar259),auVar287);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(fVar256 + 1.0)),auVar100,auVar105);
                auVar105 = vdpps_avx(local_a50,auVar173,0x7f);
                fVar267 = auVar96._0_4_ + auVar99._0_4_;
                auVar96 = vdpps_avx(auVar98,auVar101,0x7f);
                auVar101 = vmulss_avx512f(auVar104,auVar102);
                auVar102 = vmulss_avx512f(auVar102,auVar102);
                auVar99 = vdpps_avx(auVar98,local_a50,0x7f);
                auVar154._0_16_ =
                     vaddss_avx512f(auVar103,ZEXT416((uint)(auVar101._0_4_ * auVar102._0_4_)));
                auVar102 = vfnmadd231ss_fma(auVar96,auVar23,ZEXT416((uint)fVar267));
                auVar101 = vfnmadd231ss_fma(auVar99,auVar23,auVar105);
                auVar96 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar163 = fVar163 - auVar96._0_4_;
                auVar96 = vshufps_avx(auVar288,auVar288,0xff);
                auVar99 = vfmsub213ss_fma(auVar102,auVar154._0_16_,auVar96);
                fVar269 = auVar101._0_4_ * auVar154._0_4_;
                auVar102 = vfmsub231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar99._0_4_)),
                                           ZEXT416((uint)fVar267),ZEXT416((uint)fVar269));
                fVar256 = auVar102._0_4_;
                fVar255 = fVar255 - (fVar268 * (fVar269 / fVar256) -
                                    fVar163 * (auVar105._0_4_ / fVar256));
                auVar186 = ZEXT464((uint)fVar255);
                fVar264 = fVar264 - (fVar163 * (fVar267 / fVar256) -
                                    fVar268 * (auVar99._0_4_ / fVar256));
                auVar105 = vandps_avx(auVar23,auVar284);
                if (auVar100._0_4_ <= auVar105._0_4_) {
LAB_01cb41be:
                  bVar9 = false;
                }
                else {
                  auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar100._0_4_ + auVar287._0_4_)),
                                            local_9c0,ZEXT416(0x36000000));
                  auVar105 = vandps_avx(auVar284,ZEXT416((uint)fVar163));
                  if (auVar99._0_4_ <= auVar105._0_4_) goto LAB_01cb41be;
                  fVar264 = fVar264 + (float)local_9b0._0_4_;
                  bVar9 = true;
                  if ((((fVar162 <= fVar264) &&
                       (fVar267 = *(float *)(ray + k * 4 + 0x200), fVar264 <= fVar267)) &&
                      (0.0 <= fVar255)) && (fVar255 <= 1.0)) {
                    auVar153._16_48_ = auVar154._16_48_;
                    auVar153._0_16_ = ZEXT816(0) << 0x20;
                    auVar152._4_60_ = auVar153._4_60_;
                    auVar152._0_4_ = fVar266;
                    auVar105 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar152._0_16_);
                    fVar266 = auVar105._0_4_;
                    auVar154._0_16_ = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar81].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      fVar266 = fVar266 * 1.5 + auVar154._0_4_ * fVar266 * fVar266 * fVar266;
                      auVar202._0_4_ = auVar98._0_4_ * fVar266;
                      auVar202._4_4_ = auVar98._4_4_ * fVar266;
                      auVar202._8_4_ = auVar98._8_4_ * fVar266;
                      auVar202._12_4_ = auVar98._12_4_ * fVar266;
                      auVar96 = vfmadd213ps_fma(auVar96,auVar202,auVar288);
                      auVar97 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar105 = vshufps_avx(auVar288,auVar288,0xc9);
                      auVar203._0_4_ = auVar202._0_4_ * auVar105._0_4_;
                      auVar203._4_4_ = auVar202._4_4_ * auVar105._4_4_;
                      auVar203._8_4_ = auVar202._8_4_ * auVar105._8_4_;
                      auVar203._12_4_ = auVar202._12_4_ * auVar105._12_4_;
                      auVar105 = vfmsub231ps_fma(auVar203,auVar288,auVar97);
                      auVar97 = vshufps_avx(auVar105,auVar105,0xc9);
                      auVar288 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                      auVar175._0_4_ = auVar96._0_4_ * auVar105._0_4_;
                      auVar175._4_4_ = auVar96._4_4_ * auVar105._4_4_;
                      auVar175._8_4_ = auVar96._8_4_ * auVar105._8_4_;
                      auVar175._12_4_ = auVar96._12_4_ * auVar105._12_4_;
                      auVar97 = vfmsub231ps_fma(auVar175,auVar97,auVar288);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar264;
                        uVar239 = vextractps_avx(auVar97,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar239;
                        uVar239 = vextractps_avx(auVar97,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar239;
                        *(int *)(ray + k * 4 + 0x380) = auVar97._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar255;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(int *)(ray + k * 4 + 0x440) = (int)local_aa8;
                        *(uint *)(ray + k * 4 + 0x480) = uVar81;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar7 = context->user;
                        auVar288 = ZEXT416((uint)fVar255);
                        local_340 = vbroadcastss_avx512f(auVar288);
                        auVar292 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar292 = vpermps_avx512f(auVar292,ZEXT1664(auVar97));
                        auVar304 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar304,ZEXT1664(auVar97));
                        local_380 = vbroadcastss_avx512f(auVar97);
                        local_400[0] = (RTCHitN)auVar292[0];
                        local_400[1] = (RTCHitN)auVar292[1];
                        local_400[2] = (RTCHitN)auVar292[2];
                        local_400[3] = (RTCHitN)auVar292[3];
                        local_400[4] = (RTCHitN)auVar292[4];
                        local_400[5] = (RTCHitN)auVar292[5];
                        local_400[6] = (RTCHitN)auVar292[6];
                        local_400[7] = (RTCHitN)auVar292[7];
                        local_400[8] = (RTCHitN)auVar292[8];
                        local_400[9] = (RTCHitN)auVar292[9];
                        local_400[10] = (RTCHitN)auVar292[10];
                        local_400[0xb] = (RTCHitN)auVar292[0xb];
                        local_400[0xc] = (RTCHitN)auVar292[0xc];
                        local_400[0xd] = (RTCHitN)auVar292[0xd];
                        local_400[0xe] = (RTCHitN)auVar292[0xe];
                        local_400[0xf] = (RTCHitN)auVar292[0xf];
                        local_400[0x10] = (RTCHitN)auVar292[0x10];
                        local_400[0x11] = (RTCHitN)auVar292[0x11];
                        local_400[0x12] = (RTCHitN)auVar292[0x12];
                        local_400[0x13] = (RTCHitN)auVar292[0x13];
                        local_400[0x14] = (RTCHitN)auVar292[0x14];
                        local_400[0x15] = (RTCHitN)auVar292[0x15];
                        local_400[0x16] = (RTCHitN)auVar292[0x16];
                        local_400[0x17] = (RTCHitN)auVar292[0x17];
                        local_400[0x18] = (RTCHitN)auVar292[0x18];
                        local_400[0x19] = (RTCHitN)auVar292[0x19];
                        local_400[0x1a] = (RTCHitN)auVar292[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar292[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar292[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar292[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar292[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar292[0x1f];
                        local_400[0x20] = (RTCHitN)auVar292[0x20];
                        local_400[0x21] = (RTCHitN)auVar292[0x21];
                        local_400[0x22] = (RTCHitN)auVar292[0x22];
                        local_400[0x23] = (RTCHitN)auVar292[0x23];
                        local_400[0x24] = (RTCHitN)auVar292[0x24];
                        local_400[0x25] = (RTCHitN)auVar292[0x25];
                        local_400[0x26] = (RTCHitN)auVar292[0x26];
                        local_400[0x27] = (RTCHitN)auVar292[0x27];
                        local_400[0x28] = (RTCHitN)auVar292[0x28];
                        local_400[0x29] = (RTCHitN)auVar292[0x29];
                        local_400[0x2a] = (RTCHitN)auVar292[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar292[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar292[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar292[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar292[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar292[0x2f];
                        local_400[0x30] = (RTCHitN)auVar292[0x30];
                        local_400[0x31] = (RTCHitN)auVar292[0x31];
                        local_400[0x32] = (RTCHitN)auVar292[0x32];
                        local_400[0x33] = (RTCHitN)auVar292[0x33];
                        local_400[0x34] = (RTCHitN)auVar292[0x34];
                        local_400[0x35] = (RTCHitN)auVar292[0x35];
                        local_400[0x36] = (RTCHitN)auVar292[0x36];
                        local_400[0x37] = (RTCHitN)auVar292[0x37];
                        local_400[0x38] = (RTCHitN)auVar292[0x38];
                        local_400[0x39] = (RTCHitN)auVar292[0x39];
                        local_400[0x3a] = (RTCHitN)auVar292[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar292[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar292[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar292[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar292[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar292[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar292 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar292);
                        auVar108 = vpcmpeqd_avx2(auVar292._0_32_,auVar292._0_32_);
                        local_ab8[3] = auVar108;
                        local_ab8[2] = auVar108;
                        local_ab8[1] = auVar108;
                        *local_ab8 = auVar108;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar7->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar7->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar264;
                        local_8c0 = local_4c0;
                        local_b30.valid = (int *)local_8c0;
                        local_b30.geometryUserPtr = pGVar3->userPtr;
                        local_b30.context = context->user;
                        local_b30.hit = local_400;
                        local_b30.N = 0x10;
                        local_b30.ray = (RTCRayN *)ray;
                        if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar285 = ZEXT1664(auVar284);
                          auVar297 = ZEXT1664(auVar98);
                          (*pGVar3->intersectionFilterN)(&local_b30);
                          auVar186 = ZEXT1664(auVar288);
                          auVar303 = ZEXT3264(local_aa0);
                        }
                        auVar154 = vmovdqa64_avx512f(local_8c0);
                        uVar24 = vptestmd_avx512f(auVar154,auVar154);
                        if ((short)uVar24 != 0) {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            auVar297 = ZEXT1664(auVar297._0_16_);
                            (*p_Var8)(&local_b30);
                            auVar186 = ZEXT1664(auVar288);
                            auVar303 = ZEXT3264(local_aa0);
                          }
                          auVar154 = vmovdqa64_avx512f(local_8c0);
                          uVar89 = vptestmd_avx512f(auVar154,auVar154);
                          if ((short)uVar89 != 0) {
                            iVar57 = *(int *)(local_b30.hit + 4);
                            iVar58 = *(int *)(local_b30.hit + 8);
                            iVar59 = *(int *)(local_b30.hit + 0xc);
                            iVar60 = *(int *)(local_b30.hit + 0x10);
                            iVar61 = *(int *)(local_b30.hit + 0x14);
                            iVar62 = *(int *)(local_b30.hit + 0x18);
                            iVar63 = *(int *)(local_b30.hit + 0x1c);
                            iVar64 = *(int *)(local_b30.hit + 0x20);
                            iVar65 = *(int *)(local_b30.hit + 0x24);
                            iVar66 = *(int *)(local_b30.hit + 0x28);
                            iVar67 = *(int *)(local_b30.hit + 0x2c);
                            iVar68 = *(int *)(local_b30.hit + 0x30);
                            iVar69 = *(int *)(local_b30.hit + 0x34);
                            iVar70 = *(int *)(local_b30.hit + 0x38);
                            iVar71 = *(int *)(local_b30.hit + 0x3c);
                            bVar83 = (byte)uVar89;
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar78 = (byte)(uVar89 >> 8);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x300) =
                                 (uint)(bVar83 & 1) * *(int *)local_b30.hit |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_b30.ray + 0x300);
                            *(uint *)(local_b30.ray + 0x304) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x304);
                            *(uint *)(local_b30.ray + 0x308) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x308);
                            *(uint *)(local_b30.ray + 0x30c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x30c);
                            *(uint *)(local_b30.ray + 0x310) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x310);
                            *(uint *)(local_b30.ray + 0x314) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x314);
                            *(uint *)(local_b30.ray + 0x318) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x318);
                            *(uint *)(local_b30.ray + 0x31c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x31c);
                            *(uint *)(local_b30.ray + 800) =
                                 (uint)(bVar78 & 1) * iVar64 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 800);
                            *(uint *)(local_b30.ray + 0x324) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x324);
                            *(uint *)(local_b30.ray + 0x328) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x328);
                            *(uint *)(local_b30.ray + 0x32c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x32c);
                            *(uint *)(local_b30.ray + 0x330) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x330);
                            *(uint *)(local_b30.ray + 0x334) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x334);
                            *(uint *)(local_b30.ray + 0x338) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x338);
                            *(uint *)(local_b30.ray + 0x33c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x33c);
                            iVar57 = *(int *)(local_b30.hit + 0x44);
                            iVar58 = *(int *)(local_b30.hit + 0x48);
                            iVar59 = *(int *)(local_b30.hit + 0x4c);
                            iVar60 = *(int *)(local_b30.hit + 0x50);
                            iVar61 = *(int *)(local_b30.hit + 0x54);
                            iVar62 = *(int *)(local_b30.hit + 0x58);
                            iVar63 = *(int *)(local_b30.hit + 0x5c);
                            iVar64 = *(int *)(local_b30.hit + 0x60);
                            iVar65 = *(int *)(local_b30.hit + 100);
                            iVar66 = *(int *)(local_b30.hit + 0x68);
                            iVar67 = *(int *)(local_b30.hit + 0x6c);
                            iVar68 = *(int *)(local_b30.hit + 0x70);
                            iVar69 = *(int *)(local_b30.hit + 0x74);
                            iVar70 = *(int *)(local_b30.hit + 0x78);
                            iVar71 = *(int *)(local_b30.hit + 0x7c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x340) =
                                 (uint)(bVar83 & 1) * *(int *)(local_b30.hit + 0x40) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_b30.ray + 0x340);
                            *(uint *)(local_b30.ray + 0x344) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x344);
                            *(uint *)(local_b30.ray + 0x348) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x348);
                            *(uint *)(local_b30.ray + 0x34c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x34c);
                            *(uint *)(local_b30.ray + 0x350) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x350);
                            *(uint *)(local_b30.ray + 0x354) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x354);
                            *(uint *)(local_b30.ray + 0x358) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x358);
                            *(uint *)(local_b30.ray + 0x35c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x35c);
                            *(uint *)(local_b30.ray + 0x360) =
                                 (uint)(bVar78 & 1) * iVar64 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x360);
                            *(uint *)(local_b30.ray + 0x364) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x364);
                            *(uint *)(local_b30.ray + 0x368) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x368);
                            *(uint *)(local_b30.ray + 0x36c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x36c);
                            *(uint *)(local_b30.ray + 0x370) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x370);
                            *(uint *)(local_b30.ray + 0x374) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x374);
                            *(uint *)(local_b30.ray + 0x378) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x378);
                            *(uint *)(local_b30.ray + 0x37c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x37c);
                            iVar57 = *(int *)(local_b30.hit + 0x84);
                            iVar58 = *(int *)(local_b30.hit + 0x88);
                            iVar59 = *(int *)(local_b30.hit + 0x8c);
                            iVar60 = *(int *)(local_b30.hit + 0x90);
                            iVar61 = *(int *)(local_b30.hit + 0x94);
                            iVar62 = *(int *)(local_b30.hit + 0x98);
                            iVar63 = *(int *)(local_b30.hit + 0x9c);
                            iVar64 = *(int *)(local_b30.hit + 0xa0);
                            iVar65 = *(int *)(local_b30.hit + 0xa4);
                            iVar66 = *(int *)(local_b30.hit + 0xa8);
                            iVar67 = *(int *)(local_b30.hit + 0xac);
                            iVar68 = *(int *)(local_b30.hit + 0xb0);
                            iVar69 = *(int *)(local_b30.hit + 0xb4);
                            iVar70 = *(int *)(local_b30.hit + 0xb8);
                            iVar71 = *(int *)(local_b30.hit + 0xbc);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x380) =
                                 (uint)(bVar83 & 1) * *(int *)(local_b30.hit + 0x80) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_b30.ray + 0x380);
                            *(uint *)(local_b30.ray + 900) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 900);
                            *(uint *)(local_b30.ray + 0x388) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x388);
                            *(uint *)(local_b30.ray + 0x38c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x38c);
                            *(uint *)(local_b30.ray + 0x390) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x390);
                            *(uint *)(local_b30.ray + 0x394) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x394);
                            *(uint *)(local_b30.ray + 0x398) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x398);
                            *(uint *)(local_b30.ray + 0x39c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x39c);
                            *(uint *)(local_b30.ray + 0x3a0) =
                                 (uint)(bVar78 & 1) * iVar64 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x3a0);
                            *(uint *)(local_b30.ray + 0x3a4) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x3a4);
                            *(uint *)(local_b30.ray + 0x3a8) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x3a8);
                            *(uint *)(local_b30.ray + 0x3ac) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ac);
                            *(uint *)(local_b30.ray + 0x3b0) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x3b0);
                            *(uint *)(local_b30.ray + 0x3b4) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x3b4);
                            *(uint *)(local_b30.ray + 0x3b8) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x3b8);
                            *(uint *)(local_b30.ray + 0x3bc) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x3bc);
                            iVar57 = *(int *)(local_b30.hit + 0xc4);
                            iVar58 = *(int *)(local_b30.hit + 200);
                            iVar59 = *(int *)(local_b30.hit + 0xcc);
                            iVar60 = *(int *)(local_b30.hit + 0xd0);
                            iVar61 = *(int *)(local_b30.hit + 0xd4);
                            iVar62 = *(int *)(local_b30.hit + 0xd8);
                            iVar63 = *(int *)(local_b30.hit + 0xdc);
                            iVar64 = *(int *)(local_b30.hit + 0xe0);
                            iVar65 = *(int *)(local_b30.hit + 0xe4);
                            iVar66 = *(int *)(local_b30.hit + 0xe8);
                            iVar67 = *(int *)(local_b30.hit + 0xec);
                            iVar68 = *(int *)(local_b30.hit + 0xf0);
                            iVar69 = *(int *)(local_b30.hit + 0xf4);
                            iVar70 = *(int *)(local_b30.hit + 0xf8);
                            iVar71 = *(int *)(local_b30.hit + 0xfc);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x3c0) =
                                 (uint)(bVar83 & 1) * *(int *)(local_b30.hit + 0xc0) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_b30.ray + 0x3c0);
                            *(uint *)(local_b30.ray + 0x3c4) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x3c4);
                            *(uint *)(local_b30.ray + 0x3c8) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x3c8);
                            *(uint *)(local_b30.ray + 0x3cc) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x3cc);
                            *(uint *)(local_b30.ray + 0x3d0) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x3d0);
                            *(uint *)(local_b30.ray + 0x3d4) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x3d4);
                            *(uint *)(local_b30.ray + 0x3d8) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x3d8);
                            *(uint *)(local_b30.ray + 0x3dc) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x3dc);
                            *(uint *)(local_b30.ray + 0x3e0) =
                                 (uint)(bVar78 & 1) * iVar64 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x3e0);
                            *(uint *)(local_b30.ray + 0x3e4) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x3e4);
                            *(uint *)(local_b30.ray + 1000) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 1000);
                            *(uint *)(local_b30.ray + 0x3ec) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x3ec);
                            *(uint *)(local_b30.ray + 0x3f0) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x3f0);
                            *(uint *)(local_b30.ray + 0x3f4) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x3f4);
                            *(uint *)(local_b30.ray + 0x3f8) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x3f8);
                            *(uint *)(local_b30.ray + 0x3fc) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x3fc);
                            iVar57 = *(int *)(local_b30.hit + 0x104);
                            iVar58 = *(int *)(local_b30.hit + 0x108);
                            iVar59 = *(int *)(local_b30.hit + 0x10c);
                            iVar60 = *(int *)(local_b30.hit + 0x110);
                            iVar61 = *(int *)(local_b30.hit + 0x114);
                            iVar62 = *(int *)(local_b30.hit + 0x118);
                            iVar63 = *(int *)(local_b30.hit + 0x11c);
                            iVar64 = *(int *)(local_b30.hit + 0x120);
                            iVar65 = *(int *)(local_b30.hit + 0x124);
                            iVar66 = *(int *)(local_b30.hit + 0x128);
                            iVar67 = *(int *)(local_b30.hit + 300);
                            iVar68 = *(int *)(local_b30.hit + 0x130);
                            iVar69 = *(int *)(local_b30.hit + 0x134);
                            iVar70 = *(int *)(local_b30.hit + 0x138);
                            iVar71 = *(int *)(local_b30.hit + 0x13c);
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            bVar10 = (bool)((byte)(uVar89 >> 2) & 1);
                            bVar11 = (bool)((byte)(uVar89 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar89 >> 4) & 1);
                            bVar13 = (bool)((byte)(uVar89 >> 5) & 1);
                            bVar14 = (bool)((byte)(uVar89 >> 6) & 1);
                            bVar15 = (bool)((byte)(uVar89 >> 7) & 1);
                            bVar16 = (bool)((byte)(uVar89 >> 9) & 1);
                            bVar17 = (bool)((byte)(uVar89 >> 10) & 1);
                            bVar18 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            bVar19 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            bVar20 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            bVar21 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            bVar22 = SUB81(uVar89 >> 0xf,0);
                            *(uint *)(local_b30.ray + 0x400) =
                                 (uint)(bVar83 & 1) * *(int *)(local_b30.hit + 0x100) |
                                 (uint)!(bool)(bVar83 & 1) * *(int *)(local_b30.ray + 0x400);
                            *(uint *)(local_b30.ray + 0x404) =
                                 (uint)bVar88 * iVar57 |
                                 (uint)!bVar88 * *(int *)(local_b30.ray + 0x404);
                            *(uint *)(local_b30.ray + 0x408) =
                                 (uint)bVar10 * iVar58 |
                                 (uint)!bVar10 * *(int *)(local_b30.ray + 0x408);
                            *(uint *)(local_b30.ray + 0x40c) =
                                 (uint)bVar11 * iVar59 |
                                 (uint)!bVar11 * *(int *)(local_b30.ray + 0x40c);
                            *(uint *)(local_b30.ray + 0x410) =
                                 (uint)bVar12 * iVar60 |
                                 (uint)!bVar12 * *(int *)(local_b30.ray + 0x410);
                            *(uint *)(local_b30.ray + 0x414) =
                                 (uint)bVar13 * iVar61 |
                                 (uint)!bVar13 * *(int *)(local_b30.ray + 0x414);
                            *(uint *)(local_b30.ray + 0x418) =
                                 (uint)bVar14 * iVar62 |
                                 (uint)!bVar14 * *(int *)(local_b30.ray + 0x418);
                            *(uint *)(local_b30.ray + 0x41c) =
                                 (uint)bVar15 * iVar63 |
                                 (uint)!bVar15 * *(int *)(local_b30.ray + 0x41c);
                            *(uint *)(local_b30.ray + 0x420) =
                                 (uint)(bVar78 & 1) * iVar64 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b30.ray + 0x420);
                            *(uint *)(local_b30.ray + 0x424) =
                                 (uint)bVar16 * iVar65 |
                                 (uint)!bVar16 * *(int *)(local_b30.ray + 0x424);
                            *(uint *)(local_b30.ray + 0x428) =
                                 (uint)bVar17 * iVar66 |
                                 (uint)!bVar17 * *(int *)(local_b30.ray + 0x428);
                            *(uint *)(local_b30.ray + 0x42c) =
                                 (uint)bVar18 * iVar67 |
                                 (uint)!bVar18 * *(int *)(local_b30.ray + 0x42c);
                            *(uint *)(local_b30.ray + 0x430) =
                                 (uint)bVar19 * iVar68 |
                                 (uint)!bVar19 * *(int *)(local_b30.ray + 0x430);
                            *(uint *)(local_b30.ray + 0x434) =
                                 (uint)bVar20 * iVar69 |
                                 (uint)!bVar20 * *(int *)(local_b30.ray + 0x434);
                            *(uint *)(local_b30.ray + 0x438) =
                                 (uint)bVar21 * iVar70 |
                                 (uint)!bVar21 * *(int *)(local_b30.ray + 0x438);
                            *(uint *)(local_b30.ray + 0x43c) =
                                 (uint)bVar22 * iVar71 |
                                 (uint)!bVar22 * *(int *)(local_b30.ray + 0x43c);
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x140));
                            auVar292 = vmovdqu32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x440) = auVar292;
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x180));
                            auVar292 = vmovdqu32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x480) = auVar292;
                            auVar304 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x1c0));
                            auVar292 = vmovdqa32_avx512f(auVar304);
                            *(undefined1 (*) [64])(local_b30.ray + 0x4c0) = auVar292;
                            auVar292 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b30.hit + 0x200));
                            bVar88 = (bool)((byte)(uVar89 >> 1) & 1);
                            auVar53._4_56_ = auVar292._8_56_;
                            auVar53._0_4_ =
                                 (uint)bVar88 * auVar292._4_4_ | (uint)!bVar88 * auVar304._4_4_;
                            auVar154._0_8_ = auVar53._0_8_ << 0x20;
                            bVar88 = (bool)((byte)(uVar89 >> 2) & 1);
                            auVar154._8_4_ =
                                 (uint)bVar88 * auVar292._8_4_ | (uint)!bVar88 * auVar304._8_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 3) & 1);
                            auVar154._12_4_ =
                                 (uint)bVar88 * auVar292._12_4_ | (uint)!bVar88 * auVar304._12_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 4) & 1);
                            auVar154._16_4_ =
                                 (uint)bVar88 * auVar292._16_4_ | (uint)!bVar88 * auVar304._16_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 5) & 1);
                            auVar154._20_4_ =
                                 (uint)bVar88 * auVar292._20_4_ | (uint)!bVar88 * auVar304._20_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 6) & 1);
                            auVar154._24_4_ =
                                 (uint)bVar88 * auVar292._24_4_ | (uint)!bVar88 * auVar304._24_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 7) & 1);
                            auVar154._28_4_ =
                                 (uint)bVar88 * auVar292._28_4_ | (uint)!bVar88 * auVar304._28_4_;
                            auVar154._32_4_ =
                                 (uint)(bVar78 & 1) * auVar292._32_4_ |
                                 (uint)!(bool)(bVar78 & 1) * auVar304._32_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 9) & 1);
                            auVar154._36_4_ =
                                 (uint)bVar88 * auVar292._36_4_ | (uint)!bVar88 * auVar304._36_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 10) & 1);
                            auVar154._40_4_ =
                                 (uint)bVar88 * auVar292._40_4_ | (uint)!bVar88 * auVar304._40_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xb) & 1);
                            auVar154._44_4_ =
                                 (uint)bVar88 * auVar292._44_4_ | (uint)!bVar88 * auVar304._44_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xc) & 1);
                            auVar154._48_4_ =
                                 (uint)bVar88 * auVar292._48_4_ | (uint)!bVar88 * auVar304._48_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xd) & 1);
                            auVar154._52_4_ =
                                 (uint)bVar88 * auVar292._52_4_ | (uint)!bVar88 * auVar304._52_4_;
                            bVar88 = (bool)((byte)(uVar89 >> 0xe) & 1);
                            auVar154._56_4_ =
                                 (uint)bVar88 * auVar292._56_4_ | (uint)!bVar88 * auVar304._56_4_;
                            bVar88 = SUB81(uVar89 >> 0xf,0);
                            auVar154._60_4_ =
                                 (uint)bVar88 * auVar292._60_4_ | (uint)!bVar88 * auVar304._60_4_;
                            auVar292 = vmovdqa32_avx512f(auVar292);
                            *(undefined1 (*) [64])(local_b30.ray + 0x500) = auVar292;
                            goto LAB_01cb41c1;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar267;
                      }
                    }
                  }
                }
LAB_01cb41c1:
                auVar108 = auVar154._32_32_;
                bVar88 = lVar87 != 0;
                lVar87 = lVar87 + -1;
              } while ((!bVar9) && (bVar88));
              auVar73._4_4_ = fStack_85c;
              auVar73._0_4_ = local_860;
              auVar73._8_4_ = fStack_858;
              auVar73._12_4_ = fStack_854;
              auVar73._16_4_ = fStack_850;
              auVar73._20_4_ = fStack_84c;
              auVar73._24_4_ = fStack_848;
              auVar73._28_4_ = fStack_844;
              uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar44._4_4_ = uVar239;
              auVar44._0_4_ = uVar239;
              auVar44._8_4_ = uVar239;
              auVar44._12_4_ = uVar239;
              auVar44._16_4_ = uVar239;
              auVar44._20_4_ = uVar239;
              auVar44._24_4_ = uVar239;
              auVar44._28_4_ = uVar239;
              uVar24 = vcmpps_avx512vl(auVar73,auVar44,2);
              bVar84 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar84 & (byte)uVar24;
            } while (bVar84 != 0);
          }
          uVar25 = vpcmpd_avx512vl(local_7e0,_local_880,1);
          uVar26 = vpcmpd_avx512vl(local_7e0,local_740,1);
          auVar205._0_4_ = (float)local_940._0_4_ + (float)local_500._0_4_;
          auVar205._4_4_ = (float)local_940._4_4_ + (float)local_500._4_4_;
          auVar205._8_4_ = fStack_938 + fStack_4f8;
          auVar205._12_4_ = fStack_934 + fStack_4f4;
          auVar205._16_4_ = fStack_930 + fStack_4f0;
          auVar205._20_4_ = fStack_92c + fStack_4ec;
          auVar205._24_4_ = fStack_928 + fStack_4e8;
          auVar205._28_4_ = fStack_924 + fStack_4e4;
          uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar223._4_4_ = uVar239;
          auVar223._0_4_ = uVar239;
          auVar223._8_4_ = uVar239;
          auVar223._12_4_ = uVar239;
          auVar223._16_4_ = uVar239;
          auVar223._20_4_ = uVar239;
          auVar223._24_4_ = uVar239;
          auVar223._28_4_ = uVar239;
          uVar24 = vcmpps_avx512vl(auVar205,auVar223,2);
          bVar80 = bVar80 & (byte)uVar26 & (byte)uVar24;
          auVar237._0_4_ = (float)local_940._0_4_ + (float)local_780._0_4_;
          auVar237._4_4_ = (float)local_940._4_4_ + (float)local_780._4_4_;
          auVar237._8_4_ = fStack_938 + fStack_778;
          auVar237._12_4_ = fStack_934 + fStack_774;
          auVar237._16_4_ = fStack_930 + fStack_770;
          auVar237._20_4_ = fStack_92c + fStack_76c;
          auVar237._24_4_ = fStack_928 + fStack_768;
          auVar237._28_4_ = fStack_924 + fStack_764;
          auVar238 = ZEXT3264(auVar237);
          uVar24 = vcmpps_avx512vl(auVar237,auVar223,2);
          bVar82 = bVar82 & (byte)uVar25 & (byte)uVar24 | bVar80;
          if (bVar82 == 0) {
            auVar186 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar292 = ZEXT3264(_DAT_02020f20);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar304 = ZEXT3264(auVar109);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar302 = ZEXT3264(auVar109);
          }
          else {
            abStack_1a0[uVar79 * 0x60] = bVar82;
            bVar9 = (bool)(bVar80 >> 1 & 1);
            bVar88 = (bool)(bVar80 >> 2 & 1);
            bVar10 = (bool)(bVar80 >> 3 & 1);
            bVar11 = (bool)(bVar80 >> 4 & 1);
            bVar12 = (bool)(bVar80 >> 5 & 1);
            auStack_180[uVar79 * 0x18] =
                 (uint)(bVar80 & 1) * local_500._0_4_ | (uint)!(bool)(bVar80 & 1) * local_780._0_4_;
            auStack_180[uVar79 * 0x18 + 1] =
                 (uint)bVar9 * local_500._4_4_ | (uint)!bVar9 * local_780._4_4_;
            auStack_180[uVar79 * 0x18 + 2] =
                 (uint)bVar88 * (int)fStack_4f8 | (uint)!bVar88 * (int)fStack_778;
            auStack_180[uVar79 * 0x18 + 3] =
                 (uint)bVar10 * (int)fStack_4f4 | (uint)!bVar10 * (int)fStack_774;
            auStack_180[uVar79 * 0x18 + 4] =
                 (uint)bVar11 * (int)fStack_4f0 | (uint)!bVar11 * (int)fStack_770;
            auStack_180[uVar79 * 0x18 + 5] =
                 (uint)bVar12 * (int)fStack_4ec | (uint)!bVar12 * (int)fStack_76c;
            auStack_180[uVar79 * 0x18 + 6] =
                 (uint)(bVar80 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar80 >> 6) * (int)fStack_768;
            (&fStack_164)[uVar79 * 0x18] = fStack_764;
            uVar24 = vmovlps_avx(local_a70);
            (&uStack_160)[uVar79 * 0xc] = uVar24;
            afStack_158[uVar79 * 0x18] = (float)((int)local_ab0 + 1);
            uVar79 = (ulong)((int)uVar79 + 1);
            auVar186 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar292 = ZEXT3264(_DAT_02020f20);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar304 = ZEXT3264(auVar109);
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar302 = ZEXT3264(auVar109);
          }
        }
      }
    }
    auVar224 = ZEXT1664(local_a70);
    do {
      if ((int)uVar79 == 0) {
        uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar239;
        auVar34._0_4_ = uVar239;
        auVar34._8_4_ = uVar239;
        auVar34._12_4_ = uVar239;
        uVar24 = vcmpps_avx512vl(local_7f0,auVar34,2);
        uVar81 = (uint)uVar24 & (uint)local_968 - 1 & (uint)local_968;
        local_968 = (ulong)uVar81;
        if (uVar81 == 0) {
          return;
        }
        goto LAB_01cb1c3d;
      }
      uVar89 = (ulong)((int)uVar79 - 1);
      auVar109 = *(undefined1 (*) [32])(auStack_180 + uVar89 * 0x18);
      auVar206._0_4_ = auVar109._0_4_ + (float)local_940._0_4_;
      auVar206._4_4_ = auVar109._4_4_ + (float)local_940._4_4_;
      auVar206._8_4_ = auVar109._8_4_ + fStack_938;
      auVar206._12_4_ = auVar109._12_4_ + fStack_934;
      auVar206._16_4_ = auVar109._16_4_ + fStack_930;
      auVar206._20_4_ = auVar109._20_4_ + fStack_92c;
      auVar206._24_4_ = auVar109._24_4_ + fStack_928;
      auVar206._28_4_ = auVar109._28_4_ + fStack_924;
      uVar239 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar45._4_4_ = uVar239;
      auVar45._0_4_ = uVar239;
      auVar45._8_4_ = uVar239;
      auVar45._12_4_ = uVar239;
      auVar45._16_4_ = uVar239;
      auVar45._20_4_ = uVar239;
      auVar45._24_4_ = uVar239;
      auVar45._28_4_ = uVar239;
      uVar24 = vcmpps_avx512vl(auVar206,auVar45,2);
      uVar90 = (uint)uVar24 & (uint)abStack_1a0[uVar89 * 0x60];
      bVar82 = (byte)uVar90;
      if (uVar90 != 0) {
        auVar207._8_4_ = 0x7f800000;
        auVar207._0_8_ = 0x7f8000007f800000;
        auVar207._12_4_ = 0x7f800000;
        auVar207._16_4_ = 0x7f800000;
        auVar207._20_4_ = 0x7f800000;
        auVar207._24_4_ = 0x7f800000;
        auVar207._28_4_ = 0x7f800000;
        auVar110 = vblendmps_avx512vl(auVar207,auVar109);
        auVar148._0_4_ =
             (uint)(bVar82 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar82 & 1) * (int)auVar109._0_4_;
        bVar9 = (bool)((byte)(uVar90 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar9 * auVar110._4_4_ | (uint)!bVar9 * (int)auVar109._4_4_;
        bVar9 = (bool)((byte)(uVar90 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar9 * auVar110._8_4_ | (uint)!bVar9 * (int)auVar109._8_4_;
        bVar9 = (bool)((byte)(uVar90 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar9 * auVar110._12_4_ | (uint)!bVar9 * (int)auVar109._12_4_;
        bVar9 = (bool)((byte)(uVar90 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar9 * auVar110._16_4_ | (uint)!bVar9 * (int)auVar109._16_4_;
        bVar9 = (bool)((byte)(uVar90 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar9 * auVar110._20_4_ | (uint)!bVar9 * (int)auVar109._20_4_;
        bVar9 = (bool)((byte)(uVar90 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar9 * auVar110._24_4_ | (uint)!bVar9 * (int)auVar109._24_4_;
        auVar148._28_4_ =
             (uVar90 >> 7) * auVar110._28_4_ | (uint)!SUB41(uVar90 >> 7,0) * (int)auVar109._28_4_;
        auVar109 = vshufps_avx(auVar148,auVar148,0xb1);
        auVar109 = vminps_avx(auVar148,auVar109);
        auVar110 = vshufpd_avx(auVar109,auVar109,5);
        auVar109 = vminps_avx(auVar109,auVar110);
        auVar110 = vpermpd_avx2(auVar109,0x4e);
        auVar109 = vminps_avx(auVar109,auVar110);
        uVar24 = vcmpps_avx512vl(auVar148,auVar109,0);
        bVar84 = (byte)uVar24 & bVar82;
        if (bVar84 != 0) {
          uVar90 = (uint)bVar84;
        }
        fVar259 = afStack_158[uVar89 * 0x18 + -1];
        uVar155 = 0;
        for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
          uVar155 = uVar155 + 1;
        }
        local_ab0 = (ulong)(uint)afStack_158[uVar89 * 0x18];
        bVar84 = ~('\x01' << ((byte)uVar155 & 0x1f)) & bVar82;
        abStack_1a0[uVar89 * 0x60] = bVar84;
        uVar86 = uVar89;
        if (bVar84 != 0) {
          uVar86 = uVar79;
        }
        fVar264 = *(float *)(&uStack_160 + uVar89 * 0xc);
        auVar208._4_4_ = fVar264;
        auVar208._0_4_ = fVar264;
        auVar208._8_4_ = fVar264;
        auVar208._12_4_ = fVar264;
        auVar208._16_4_ = fVar264;
        auVar208._20_4_ = fVar264;
        auVar208._24_4_ = fVar264;
        auVar208._28_4_ = fVar264;
        fVar259 = fVar259 - fVar264;
        auVar185._4_4_ = fVar259;
        auVar185._0_4_ = fVar259;
        auVar185._8_4_ = fVar259;
        auVar185._12_4_ = fVar259;
        auVar185._16_4_ = fVar259;
        auVar185._20_4_ = fVar259;
        auVar185._24_4_ = fVar259;
        auVar185._28_4_ = fVar259;
        auVar97 = vfmadd132ps_fma(auVar185,auVar208,auVar292._0_32_);
        auVar109 = ZEXT1632(auVar97);
        local_400[0] = (RTCHitN)auVar109[0];
        local_400[1] = (RTCHitN)auVar109[1];
        local_400[2] = (RTCHitN)auVar109[2];
        local_400[3] = (RTCHitN)auVar109[3];
        local_400[4] = (RTCHitN)auVar109[4];
        local_400[5] = (RTCHitN)auVar109[5];
        local_400[6] = (RTCHitN)auVar109[6];
        local_400[7] = (RTCHitN)auVar109[7];
        local_400[8] = (RTCHitN)auVar109[8];
        local_400[9] = (RTCHitN)auVar109[9];
        local_400[10] = (RTCHitN)auVar109[10];
        local_400[0xb] = (RTCHitN)auVar109[0xb];
        local_400[0xc] = (RTCHitN)auVar109[0xc];
        local_400[0xd] = (RTCHitN)auVar109[0xd];
        local_400[0xe] = (RTCHitN)auVar109[0xe];
        local_400[0xf] = (RTCHitN)auVar109[0xf];
        local_400[0x10] = (RTCHitN)auVar109[0x10];
        local_400[0x11] = (RTCHitN)auVar109[0x11];
        local_400[0x12] = (RTCHitN)auVar109[0x12];
        local_400[0x13] = (RTCHitN)auVar109[0x13];
        local_400[0x14] = (RTCHitN)auVar109[0x14];
        local_400[0x15] = (RTCHitN)auVar109[0x15];
        local_400[0x16] = (RTCHitN)auVar109[0x16];
        local_400[0x17] = (RTCHitN)auVar109[0x17];
        local_400[0x18] = (RTCHitN)auVar109[0x18];
        local_400[0x19] = (RTCHitN)auVar109[0x19];
        local_400[0x1a] = (RTCHitN)auVar109[0x1a];
        local_400[0x1b] = (RTCHitN)auVar109[0x1b];
        local_400[0x1c] = (RTCHitN)auVar109[0x1c];
        local_400[0x1d] = (RTCHitN)auVar109[0x1d];
        local_400[0x1e] = (RTCHitN)auVar109[0x1e];
        local_400[0x1f] = (RTCHitN)auVar109[0x1f];
        auVar224 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar155 * 4));
        uVar89 = uVar86;
      }
      uVar79 = uVar89;
    } while (bVar82 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }